

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

transformations_t *
opengv::absolute_pose::upnp
          (transformations_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,Indices *indices)

{
  double *pdVar1;
  plain_array<double,_30,_0,_16> *ppVar2;
  undefined8 uVar3;
  iterator iVar4;
  pointer pMVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  double *pdVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [56];
  int iVar156;
  int iVar157;
  size_t sVar158;
  double *pdVar159;
  Index outer;
  long lVar160;
  int iVar161;
  ulong uVar162;
  long lVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  double dVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  double dVar201;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  double dVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  double dVar218;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  double dVar219;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  double dVar230;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  double dVar231;
  double dVar232;
  double dVar233;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  double dVar238;
  undefined1 auVar236 [16];
  double dVar239;
  undefined1 auVar237 [32];
  double dVar240;
  double dVar241;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  double dVar248;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  double dVar249;
  double dVar250;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  double dVar257;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  double dVar258;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  double dVar259;
  double dVar260;
  undefined1 auVar262 [16];
  double dVar261;
  double dVar264;
  undefined1 in_ZMM7 [64];
  undefined1 auVar263 [64];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [64];
  undefined1 auVar268 [16];
  undefined1 auVar269 [64];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  undefined1 auVar272 [16];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  vector<double,_std::allocator<double>_> characteristicPolynomial;
  Matrix<double,_3,_1,_0,_3,_1> p_1;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  quaternions1;
  Matrix<double,_3,_1,_0,_3,_1> v_2;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  quaternions2;
  Matrix<double,_3,_1,_0,_3,_1> v;
  type tmp;
  Matrix3d Jacobian;
  rotation_t Rinv2;
  translation_t tinv_1;
  Matrix<double,_1,_10,_1,_1,_10> C;
  Matrix<double,_3,_3,_0,_3,_3> H;
  Matrix<double,_3,_1,_0,_3,_1> p;
  quaternion_t q;
  Vector3d cay;
  vector<double,_std::allocator<double>_> roots;
  Matrix<double,_10,_10,_0,_10,_10> M;
  double local_1558;
  double local_1550;
  double dStack_1548;
  double local_1540;
  double dStack_1538;
  double local_1530;
  double dStack_1528;
  vector<double,_std::allocator<double>_> local_1520;
  Matrix<double,_1,_10,_1,_1,_10> local_1500;
  double adStack_1490 [6];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  double dStack_1440;
  undefined1 auStack_1438 [16];
  double dStack_1428;
  undefined8 local_1420;
  undefined1 auStack_1418 [16];
  double dStack_1408;
  undefined8 local_1400;
  undefined1 auStack_13f8 [16];
  double dStack_13e8;
  undefined8 local_13e0;
  double dStack_13d8;
  double local_13d0;
  undefined8 uStack_13c8;
  double local_13c0;
  undefined8 uStack_13b8;
  double local_13b0;
  undefined8 uStack_13a8;
  double local_13a0;
  double dStack_1398;
  double local_1390;
  double dStack_1388;
  undefined1 local_1380 [48];
  double local_1350;
  double dStack_1348;
  double local_1340;
  double dStack_1338;
  double local_1330;
  double dStack_1328;
  double local_1320;
  double dStack_1318;
  double local_1310;
  double dStack_1308;
  undefined1 local_1300 [16];
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_12d0;
  double dStack_12b8;
  Transpose<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> local_12b0;
  Matrix<double,_3,_10,_0,_3,_10> *pMStack_12a8;
  double dStack_12a0;
  undefined1 auStack_1298 [16];
  double dStack_1288;
  double dStack_1280;
  double dStack_1278;
  double local_1270;
  double local_1260;
  double dStack_1258;
  double dStack_1250;
  double dStack_1248;
  double local_1240;
  double dStack_1238;
  double dStack_1230;
  double dStack_1228;
  double local_1220;
  double dStack_1218;
  double dStack_1210;
  double dStack_1208;
  double local_1200;
  double dStack_11f8;
  double dStack_11f0;
  double dStack_11e8;
  double local_11e0;
  double dStack_11d8;
  double dStack_11d0;
  double dStack_11c8;
  double local_11b0;
  double dStack_11a8;
  double local_11a0;
  double dStack_1198;
  double local_1190;
  double dStack_1188;
  double local_1180;
  double dStack_1178;
  double local_1170;
  double dStack_1168;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_1160;
  undefined1 local_1140 [48];
  undefined1 local_1110 [16];
  undefined1 local_1100 [8];
  double dStack_10f8;
  Matrix<double,_3,_10,_0,_3,_10> local_10f0;
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  double dStack_fe0;
  double dStack_fd8;
  undefined1 auStack_fd0 [16];
  double local_fc0;
  undefined1 auStack_fb8 [16];
  double dStack_fa8;
  double local_fa0;
  double dStack_f98;
  double dStack_f90;
  double dStack_f88;
  double local_f80;
  double dStack_f78;
  double dStack_f70;
  double dStack_f68;
  double local_f60;
  double dStack_f58;
  double dStack_f50;
  double dStack_f48;
  double local_f40;
  double dStack_f38;
  double dStack_f30;
  double dStack_f28;
  double local_f20;
  double dStack_f18;
  double dStack_f10;
  double dStack_f08;
  double local_f00;
  double dStack_ef8;
  double dStack_ef0;
  double dStack_ee8;
  double local_ee0;
  double dStack_ed8;
  double dStack_ed0;
  double dStack_ec8;
  double local_ec0;
  double dStack_eb8;
  double dStack_eb0;
  double dStack_ea8;
  double local_ea0;
  double dStack_e98;
  double dStack_e90;
  double dStack_e88;
  double local_e80;
  double dStack_e78;
  double dStack_e70;
  double dStack_e68;
  double local_e60;
  double dStack_e58;
  double dStack_e50;
  double dStack_e48;
  double local_e40;
  double dStack_e38;
  double dStack_e30;
  double dStack_e28;
  double local_e20;
  double dStack_e18;
  double dStack_e10;
  double dStack_e08;
  double local_e00;
  double dStack_df8;
  double dStack_df0;
  double dStack_de8;
  double local_de0;
  double dStack_dd8;
  double dStack_dd0;
  double dStack_dc8;
  double local_dc0;
  double dStack_db8;
  double dStack_db0;
  double dStack_da8;
  double local_da0;
  double dStack_d98;
  double dStack_d90;
  double dStack_d88;
  double local_d80;
  double dStack_d78;
  double dStack_d70;
  double dStack_d68;
  double local_d60;
  double dStack_d58;
  double dStack_d50;
  double dStack_d48;
  double local_d40;
  double dStack_d38;
  double dStack_d30;
  double dStack_d28;
  double local_d20;
  double dStack_d18;
  double dStack_d10;
  double dStack_d08;
  double local_d00;
  double dStack_cf8;
  double dStack_cf0;
  double dStack_ce8;
  undefined1 local_ce0 [104];
  Matrix<double,_3,_10,_0,_3,_10> *pMStack_c78;
  double *pdStack_c70;
  undefined1 auStack_c68 [24];
  double dStack_c50;
  double dStack_c48;
  double local_c40;
  double local_c30;
  double dStack_c28;
  double local_c20;
  double dStack_c18;
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  double local_bf0;
  double dStack_be8;
  double local_be0;
  double dStack_bd8;
  double local_bd0;
  double dStack_bc8;
  double local_bc0;
  double dStack_bb8;
  double local_bb0;
  double dStack_ba8;
  ulong local_b98;
  double local_b90;
  double local_b88;
  undefined1 local_b80 [16];
  double dStack_b70;
  double dStack_b68;
  undefined1 local_b60 [16];
  double dStack_b50;
  double dStack_b48;
  double local_b40;
  double dStack_b38;
  double dStack_b30;
  double dStack_b28;
  double local_b20;
  double dStack_b18;
  double dStack_b10;
  double dStack_b08;
  double local_b00;
  double dStack_af8;
  double dStack_af0;
  double dStack_ae8;
  undefined1 local_ae0 [16];
  double local_ad0;
  Matrix<double,_1,_10,_1,_1,_10> local_ac0;
  undefined1 local_a50 [16];
  double local_a40;
  double dStack_a38;
  double dStack_a30;
  double local_a28;
  undefined1 local_a20 [16];
  double local_a10 [2];
  undefined1 local_a00 [40];
  double dStack_9d8;
  double dStack_9d0;
  double dStack_9c8;
  double local_9c0;
  double dStack_9b8;
  double dStack_9b0;
  double dStack_9a8;
  double local_9a0;
  double dStack_998;
  double dStack_990;
  double dStack_988;
  double local_980;
  double dStack_978;
  double dStack_970;
  double dStack_968;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  quaternion_t local_6e0;
  undefined1 local_6b0 [16];
  double local_6a0;
  undefined1 local_690 [16];
  double local_680;
  vector<double,_std::allocator<double>_> local_678;
  Matrix<double,_10,_10,_0,_10,_10> local_660;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [16];
  double dStack_170;
  double dStack_168;
  undefined1 local_160 [16];
  double dStack_150;
  double dStack_148;
  undefined1 local_140 [16];
  double dStack_130;
  double dStack_128;
  undefined1 local_120 [16];
  double dStack_110;
  double dStack_108;
  undefined1 local_100 [16];
  double dStack_f0;
  double dStack_e8;
  undefined1 local_e0 [16];
  double dStack_d0;
  double dStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  double local_80;
  
  auVar165 = in_ZMM7._0_16_;
  sVar158 = indices->_numberCorrespondences;
  if ((int)sVar158 < 1) {
    dVar249 = 0.0;
    auVar166 = ZEXT816(0);
    auVar164 = ZEXT816(0);
    auVar167 = ZEXT816(0);
    auVar251 = ZEXT816(0);
  }
  else {
    auVar167 = ZEXT816(0);
    dVar249 = 0.0;
    auVar164 = ZEXT816(0);
    auVar166 = ZEXT816(0);
    auVar251 = ZEXT816(0);
    lVar163 = 0;
    do {
      iVar156 = (int)lVar163;
      local_1140._0_32_ = ZEXT1632(auVar251);
      local_1380._0_32_ = ZEXT1632(auVar164);
      iVar161 = iVar156;
      if (indices->_useIndices == true) {
        iVar161 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar163];
      }
      in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
      (*adapter->_vptr_AbsoluteAdapterBase[5])(local_1000,adapter,(long)iVar161);
      if (indices->_useIndices == true) {
        iVar156 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar163];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[2])(local_a00,adapter,(long)iVar156);
      auVar165 = in_ZMM7._0_16_;
      pdVar159 = (double *)(local_1000 + 0x10);
      lVar160 = 0;
      auVar6._8_8_ = local_a00._0_8_;
      auVar6._0_8_ = local_a00._0_8_;
      auVar164 = vmulpd_avx512vl(local_1000,auVar6);
      auVar7._8_8_ = local_a00._8_8_;
      auVar7._0_8_ = local_a00._8_8_;
      auVar164 = vfmadd132pd_avx512vl(stack0xfffffffffffff018,auVar164,auVar7);
      auVar187._8_8_ = local_a00._16_8_;
      auVar187._0_8_ = local_a00._16_8_;
      auVar164 = vfmadd231pd_fma(auVar164,auVar187,auStack_fd0);
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0] = (double)auVar164._0_8_;
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[1] = (double)auVar164._8_8_;
      dVar257 = (double)auStack_ff0._0_8_ * (double)local_a00._0_8_ +
                dStack_fd8 * (double)local_a00._8_8_ + (double)local_a00._16_8_ * local_fc0;
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[2] = dVar257;
      do {
        dVar186 = local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                  m_storage.m_data.array[lVar160];
        lVar160 = lVar160 + 1;
        pdVar159[-2] = auVar164._0_8_ * dVar186;
        auVar155 = stack0xfffffffffffff008;
        pdVar159[-1] = auVar164._8_8_ * dVar186;
        *pdVar159 = dVar257 * dVar186;
        pdVar159 = pdVar159 + 3;
      } while (lVar160 != 3);
      local_1530 = auVar166._0_8_;
      dStack_1528 = auVar166._8_8_;
      local_1550 = auVar167._0_8_;
      dStack_1548 = auVar167._8_8_;
      sVar158 = indices->_numberCorrespondences;
      lVar163 = lVar163 + 1;
      auVar251._0_8_ = (double)local_1140._0_8_ + (double)local_1000._0_8_;
      auVar251._8_8_ = (double)local_1140._8_8_ + (double)local_1000._8_8_;
      auVar166._0_8_ = local_1530 + (double)auStack_ff0._0_8_;
      auVar166._8_8_ = dStack_1528 + (double)auStack_ff0._8_8_;
      auVar164._0_8_ = (double)local_1380._0_8_ + dStack_fe0;
      auVar164._8_8_ = (double)local_1380._8_8_ + dStack_fd8;
      auVar167._0_8_ = local_1550 + (double)auStack_fd0._0_8_;
      auVar167._8_8_ = dStack_1548 + (double)auStack_fd0._8_8_;
      dVar249 = dVar249 + local_fc0;
      unique0x1000a471 = auVar155;
    } while (lVar163 < (int)sVar158);
  }
  auVar6 = vcvtusi2sd_avx512f(auVar165,sVar158);
  auVar217._16_16_ = auVar166;
  auVar217._0_16_ = auVar251;
  auVar237._16_16_ = auVar167;
  auVar237._0_16_ = auVar164;
  local_1000._0_8_ = local_c0;
  dVar257 = auVar6._0_8_;
  local_80 = dVar257 - dVar249;
  local_c0 = vsubpd_avx(ZEXT832((ulong)dVar257),auVar217);
  local_a0 = vsubpd_avx(ZEXT832((ulong)dVar257),auVar237);
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_0,_3,_3> *)local_a50,(SrcXprType *)local_1000,
        (assign_op<double,_double> *)&local_660);
  local_11e0 = 0.0;
  dStack_11d8 = 0.0;
  dStack_11d0 = 0.0;
  dStack_11c8 = 0.0;
  local_1200 = 0.0;
  dStack_11f8 = 0.0;
  dStack_11f0 = 0.0;
  dStack_11e8 = 0.0;
  local_1220 = 0.0;
  dStack_1218 = 0.0;
  dStack_1210 = 0.0;
  dStack_1208 = 0.0;
  local_1240 = 0.0;
  dStack_1238 = 0.0;
  dStack_1230 = 0.0;
  dStack_1228 = 0.0;
  local_1260 = 0.0;
  dStack_1258 = 0.0;
  dStack_1250 = 0.0;
  dStack_1248 = 0.0;
  sVar158 = indices->_numberCorrespondences;
  if ((int)sVar158 < 1) {
    memset(&local_660,0,800);
    local_1390 = 0.0;
    dStack_1388 = 0.0;
    local_1558 = 0.0;
    local_1310 = 0.0;
    dStack_1308 = 0.0;
    local_1320 = 0.0;
    dStack_1318 = 0.0;
    local_1330 = 0.0;
    dStack_1328 = 0.0;
    local_1340 = 0.0;
    dStack_1338 = 0.0;
    local_1350 = 0.0;
    dStack_1348 = 0.0;
LAB_00130d26:
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [0] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [9] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [8] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [7] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [6] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [5] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [4] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [3] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [2] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [1] = 0.0;
    dVar249 = 0.0;
  }
  else {
    dVar249 = 0.0;
    dVar257 = 0.0;
    auVar263 = ZEXT864(0) << 0x40;
    auVar267 = ZEXT864(0) << 0x40;
    auVar269 = ZEXT864(0) << 0x40;
    auVar271 = ZEXT864(0) << 0x40;
    auVar273 = ZEXT864(0) << 0x40;
    auVar274 = ZEXT864(0) << 0x40;
    auVar275 = ZEXT864(0) << 0x40;
    auVar276 = ZEXT864(0) << 0x40;
    auVar277 = ZEXT864(0) << 0x40;
    lVar163 = 0;
    local_1390 = 0.0;
    dStack_1388 = 0.0;
    local_1558 = 0.0;
    local_1350 = 0.0;
    dStack_1348 = 0.0;
    local_1340 = 0.0;
    dStack_1338 = 0.0;
    local_1330 = 0.0;
    dStack_1328 = 0.0;
    local_1320 = 0.0;
    dStack_1318 = 0.0;
    local_1310 = 0.0;
    dStack_1308 = 0.0;
    do {
      iVar156 = (int)lVar163;
      local_1110 = auVar277._0_16_;
      _local_1100 = auVar276._0_16_;
      local_1300 = auVar275._0_16_;
      local_12f0 = auVar274._0_16_;
      local_12e0 = auVar273._0_16_;
      local_1140._0_16_ = auVar271._0_16_;
      local_1380._0_16_ = auVar267._0_16_;
      iVar161 = iVar156;
      if (indices->_useIndices == true) {
        iVar161 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar163];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[5])(local_1000,adapter,(long)iVar161);
      iVar161 = iVar156;
      if (indices->_useIndices == true) {
        iVar161 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar163];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_660,adapter,(long)iVar161);
      lVar160 = 0x18;
      auVar8._8_8_ = local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                     m_storage.m_data.array[0];
      auVar8._0_8_ = local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                     m_storage.m_data.array[0];
      auVar165 = vmulpd_avx512vl(local_1000,auVar8);
      auVar9._8_8_ = local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                     m_storage.m_data.array[1];
      auVar9._0_8_ = local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                     m_storage.m_data.array[1];
      auVar165 = vfmadd132pd_avx512vl(stack0xfffffffffffff018,auVar165,auVar9);
      auVar168._8_8_ =
           local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[2];
      auVar168._0_8_ =
           local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[2];
      auVar165 = vfmadd231pd_fma(auVar165,auVar168,auStack_fd0);
      dVar186 = (double)auStack_ff0._0_8_ *
                local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array[0] +
                dStack_fd8 *
                local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array[1] +
                local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array[2] * local_fc0;
      dVar201 = auVar165._0_8_;
      local_1000._8_8_ = dVar201 * dVar201 + -1.0;
      auVar165 = vshufpd_avx(auVar165,auVar165,1);
      dVar202 = auVar165._0_8_;
      auStack_ff0._0_8_ = dVar201 * dVar202;
      auStack_ff0._8_8_ = dVar186 * dVar201;
      dStack_fe0 = dVar201 * dVar202;
      auVar149._8_8_ = dStack_a38;
      auVar149._0_8_ = local_a40;
      auVar165 = vmovhpd_avx(auVar149,local_a28);
      dStack_fd8 = dVar202 * dVar202 + -1.0;
      auStack_fd0._0_8_ = dVar186 * dVar202;
      auStack_fd0._8_8_ = dVar186 * dVar201;
      local_fc0 = dVar186 * dVar202;
      auStack_fb8._0_8_ = dVar186 * dVar186 + -1.0;
      auVar151._8_8_ = dStack_a30;
      auVar151._0_8_ = dStack_a38;
      do {
        auVar10._8_8_ = *(undefined8 *)(local_1000 + lVar160 + -0x10);
        auVar10._0_8_ = *(undefined8 *)(local_1000 + lVar160 + -0x10);
        auVar166 = vmulpd_avx512vl(local_a50,auVar10);
        dVar186 = *(double *)(local_1000 + lVar160);
        auVar242._8_8_ = dVar186;
        auVar242._0_8_ = dVar186;
        auVar11._8_8_ = *(undefined8 *)(local_1000 + lVar160 + -8);
        auVar11._0_8_ = *(undefined8 *)(local_1000 + lVar160 + -8);
        auVar166 = vfmadd231pd_avx512vl(auVar166,auVar151,auVar11);
        auVar166 = vfmadd231pd_fma(auVar166,local_a20,auVar242);
        *(undefined1 (*) [16])
         ((long)&local_678.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar160) = auVar166;
        auVar252._0_8_ = auVar165._0_8_ * *(double *)(local_1000 + lVar160 + -0x10);
        auVar252._8_8_ = auVar165._8_8_ * *(double *)(local_1000 + lVar160 + -8);
        auVar166 = vshufpd_avx(auVar252,auVar252,1);
        *(double *)
         ((long)local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array + lVar160 + -8) =
             auVar252._0_8_ + auVar166._0_8_ + dVar186 * local_a10[0];
        lVar160 = lVar160 + 0x18;
      } while (lVar160 != 0x60);
      iVar161 = iVar156;
      if (indices->_useIndices == true) {
        iVar161 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar163];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[6])(local_a00,adapter,(long)iVar161);
      if (indices->_useIndices == true) {
        iVar156 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar163];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[4])(&local_10f0,adapter,(long)iVar156);
      dVar202 = local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array[8];
      dVar201 = local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array[5];
      dVar186 = local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage
                .m_data.array[2];
      auVar166 = (undefined1  [16])
                 local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array._0_16_;
      lVar160 = 0x10;
      auVar188._0_8_ = -(double)local_a00._0_8_;
      auVar188._8_8_ = 0x8000000000000000;
      adStack_1490[2] = (double)local_a00._0_8_;
      adStack_1490[5] = (double)local_a00._0_8_;
      dStack_1408 = (double)local_a00._16_8_ + (double)local_a00._16_8_;
      local_1450._0_8_ = vmovlpd_avx(auVar188);
      auStack_1438._0_8_ = vmovlpd_avx(auVar188);
      dStack_13e8 = (double)local_a00._0_8_ + (double)local_a00._0_8_;
      local_1420 = 0;
      uStack_13a8 = 0;
      local_1400 = 0;
      local_13d0 = dStack_13e8;
      uStack_13b8 = 0;
      local_13c0 = dStack_1408;
      local_1450._8_8_ = local_a00._8_8_;
      dStack_1440 = -(double)local_a00._16_8_;
      auStack_1438._8_8_ = -(double)local_a00._8_8_;
      dStack_1428 = (double)local_a00._16_8_;
      local_13a0 = dStack_1408;
      adStack_1490[3] = (double)local_a00._8_8_;
      adStack_1490[4] = (double)local_a00._16_8_;
      auVar203._0_8_ = (double)local_a00._8_8_ * 2.0;
      auVar203._8_8_ = (double)local_a00._16_8_ * -2.0;
      local_1460._8_8_ = -(double)local_a00._16_8_;
      local_1460._0_8_ = -(double)local_a00._8_8_;
      auVar153._8_8_ =
           local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[4];
      auVar153._0_8_ =
           local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[3];
      auStack_1418 = vshufpd_avx(auVar203,auVar203,1);
      dStack_13d8 = (double)vmovlpd_avx(auVar203);
      auStack_13f8._8_8_ = (double)local_a00._8_8_ * -2.0;
      auStack_13f8._0_8_ = (double)local_a00._0_8_ * -2.0;
      local_13e0 = 0;
      uStack_13c8 = 0;
      local_13b0 = dStack_13e8;
      auVar169._8_8_ = 0;
      auVar169._0_8_ =
           local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[2];
      auVar189._8_8_ = 0;
      auVar189._0_8_ =
           local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[5];
      dStack_1398 = (double)vmovlpd_avx(auVar203);
      auVar154._8_8_ =
           local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[7];
      auVar154._0_8_ =
           local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.
           m_data.array[6];
      auVar165 = vunpcklpd_avx(auVar169,auVar189);
      do {
        auVar12._8_8_ = *(undefined8 *)((long)adStack_1490 + lVar160);
        auVar12._0_8_ = *(undefined8 *)((long)adStack_1490 + lVar160);
        auVar167 = vmulpd_avx512vl(auVar166,auVar12);
        dVar218 = *(double *)((long)adStack_1490 + lVar160 + 0x10);
        auVar262._8_8_ = dVar218;
        auVar262._0_8_ = dVar218;
        uVar3 = *(undefined8 *)((long)adStack_1490 + lVar160 + 8);
        auVar13._8_8_ = uVar3;
        auVar13._0_8_ = uVar3;
        auVar167 = vfmadd231pd_avx512vl(auVar167,auVar153,auVar13);
        auVar167 = vfmadd231pd_fma(auVar167,auVar154,auVar262);
        *(undefined1 (*) [16])(local_1000 + lVar160 + -0x10) = auVar167;
        auVar265._0_8_ = auVar165._0_8_ * *(double *)((long)adStack_1490 + lVar160);
        auVar265._8_8_ = auVar165._8_8_ * *(double *)((long)adStack_1490 + lVar160 + 8);
        auVar167 = vshufpd_avx(auVar265,auVar265,1);
        *(double *)(local_1000 + lVar160) = auVar265._0_8_ + auVar167._0_8_ + dVar202 * dVar218;
        lVar160 = lVar160 + 0x18;
      } while (lVar160 != 0x100);
      auVar14._8_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[0];
      auVar14._0_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[0];
      auVar166 = vmulpd_avx512vl(auVar166,auVar14);
      local_1530 = auVar269._0_8_;
      dStack_1528 = auVar269._8_8_;
      local_1550 = auVar263._0_8_;
      dStack_1548 = auVar263._8_8_;
      sVar158 = indices->_numberCorrespondences;
      lVar163 = lVar163 + 1;
      local_1350 = local_1350 + (double)local_1000._0_8_;
      dStack_1348 = dStack_1348 + (double)local_1000._8_8_;
      auVar277 = ZEXT1664(CONCAT88((double)local_1110._8_8_ + (double)auStack_ff0._8_8_,
                                   (double)local_1110._0_8_ + (double)auStack_ff0._0_8_));
      auVar276 = ZEXT1664(CONCAT88(dStack_10f8 + dStack_fd8,(double)local_1100 + dStack_fe0));
      auVar275 = ZEXT1664(CONCAT88((double)local_1300._8_8_ + (double)auStack_fb8._0_8_,
                                   (double)local_1300._0_8_ + local_fc0));
      auVar274 = ZEXT1664(CONCAT88((double)local_12f0._8_8_ + dStack_fa8,
                                   (double)local_12f0._0_8_ + (double)auStack_fb8._8_8_));
      auVar273 = ZEXT1664(CONCAT88((double)local_12e0._8_8_ + dStack_f88,
                                   (double)local_12e0._0_8_ + dStack_f90));
      auVar271 = ZEXT1664(CONCAT88((double)local_1140._8_8_ + dStack_f78,
                                   (double)local_1140._0_8_ + local_f80));
      auVar269 = ZEXT1664(CONCAT88(dStack_1528 + dStack_f58,local_1530 + local_f60));
      auVar267 = ZEXT1664(CONCAT88((double)local_1380._8_8_ + dStack_f48,
                                   (double)local_1380._0_8_ + dStack_f50));
      auVar165._0_8_ = local_1550 + dStack_f30;
      auVar165._8_8_ = dStack_1548 + dStack_f28;
      auVar263 = ZEXT1664(auVar165);
      auVar15._8_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[1];
      auVar15._0_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[1];
      auVar166 = vfmadd231pd_avx512vl(auVar166,auVar153,auVar15);
      auVar234._8_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[2];
      auVar234._0_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[2];
      local_1340 = local_1340 + (double)auStack_fd0._0_8_;
      dStack_1338 = dStack_1338 + (double)auStack_fd0._8_8_;
      auVar166 = vfmadd213pd_fma(auVar154,auVar234,auVar166);
      local_1390 = local_1390 + auVar166._0_8_;
      dStack_1388 = dStack_1388 + auVar166._8_8_;
      local_1330 = local_1330 + local_fa0;
      dStack_1328 = dStack_1328 + dStack_f98;
      local_1558 = local_1558 +
                   dVar186 * local_10f0.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                             m_storage.m_data.array[0] +
                   dVar201 * local_10f0.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                             m_storage.m_data.array[1] +
                   dVar202 * local_10f0.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                             m_storage.m_data.array[2];
      local_1320 = local_1320 + dStack_f70;
      dStack_1318 = dStack_1318 + dStack_f68;
      local_1310 = local_1310 + local_f40;
      dStack_1308 = dStack_1308 + dStack_f38;
      dVar249 = dVar249 + local_f20;
      dVar257 = dVar257 + dStack_f18;
    } while (lVar163 < (int)sVar158);
    local_1260 = auVar165._0_8_;
    dStack_1258 = auVar165._8_8_;
    dStack_1250 = dVar249;
    dStack_1248 = dVar257;
    local_1240 = local_1530 + local_f60;
    dStack_1238 = dStack_1528 + dStack_f58;
    dStack_1230 = (double)local_1380._0_8_ + dStack_f50;
    dStack_1228 = (double)local_1380._8_8_ + dStack_f48;
    local_1220 = (double)local_12e0._0_8_ + dStack_f90;
    dStack_1218 = (double)local_12e0._8_8_ + dStack_f88;
    dStack_1210 = (double)local_1140._0_8_ + local_f80;
    dStack_1208 = (double)local_1140._8_8_ + dStack_f78;
    local_1200 = (double)local_1300._0_8_ + local_fc0;
    dStack_11f8 = (double)local_1300._8_8_ + (double)auStack_fb8._0_8_;
    dStack_11f0 = (double)local_12f0._0_8_ + (double)auStack_fb8._8_8_;
    dStack_11e8 = (double)local_12f0._8_8_ + dStack_fa8;
    local_11e0 = (double)local_1110._0_8_ + (double)auStack_ff0._0_8_;
    dStack_11d8 = (double)local_1110._8_8_ + (double)auStack_ff0._8_8_;
    dStack_11d0 = (double)local_1100 + dStack_fe0;
    dStack_11c8 = dStack_10f8 + dStack_fd8;
    memset(&local_660,0,800);
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [0] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [8] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [9] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [1] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [2] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [3] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [4] = 0.0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [5] = 0.0;
    if ((int)sVar158 < 1) goto LAB_00130d26;
    dVar249 = 0.0;
    lVar163 = 0;
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [6] = local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
          array[8];
    local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [7] = local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
          array[9];
    do {
      iVar156 = (int)lVar163;
      iVar161 = iVar156;
      if (indices->_useIndices == true) {
        iVar161 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar163];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[5])(local_1000,adapter,(long)iVar161);
      iVar161 = iVar156;
      if (indices->_useIndices == true) {
        iVar161 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar163];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[2])(local_a00,adapter,(long)iVar161);
      auVar16._8_8_ = local_a00._0_8_;
      auVar16._0_8_ = local_a00._0_8_;
      auVar165 = vmulpd_avx512vl(local_1000,auVar16);
      auVar17._8_8_ = local_a00._8_8_;
      auVar17._0_8_ = local_a00._8_8_;
      auVar165 = vfmadd132pd_avx512vl(stack0xfffffffffffff018,auVar165,auVar17);
      auVar170._8_8_ = local_a00._16_8_;
      auVar170._0_8_ = local_a00._16_8_;
      auVar166 = vfmadd231pd_fma(auVar165,auVar170,auStack_fd0);
      local_1140._0_8_ = (double)local_a00._16_8_ * local_fc0;
      dVar257 = dStack_fd8 * (double)local_a00._8_8_;
      iVar161 = iVar156;
      if (indices->_useIndices == true) {
        iVar161 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar163];
      }
      local_1380._0_8_ = (double)auStack_ff0._0_8_ * (double)local_a00._0_8_;
      (*adapter->_vptr_AbsoluteAdapterBase[4])(&local_10f0,adapter,(long)iVar161);
      if (indices->_useIndices == true) {
        iVar156 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar163];
      }
      local_1380._8_8_ = 0;
      local_1380._0_8_ = (double)local_1140._0_8_ + dVar257 + (double)local_1380._0_8_;
      (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_1500,adapter,(long)iVar156);
      auVar86._8_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[2];
      auVar86._0_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[1];
      auVar165 = ZEXT816(0xc000000000000000);
      auVar190._0_8_ =
           -local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[0];
      auVar190._8_8_ = 0x8000000000000000;
      adStack_1490[2] =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[0];
      adStack_1490[5] =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[0];
      local_1450 = vunpcklpd_avx(auVar190,auVar86);
      auVar251 = local_1450;
      local_1460._0_8_ =
           -local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[1];
      local_1460._8_8_ =
           -local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[2];
      auStack_1438 = vunpcklpd_avx(auVar190,local_1460);
      auVar6 = auStack_1438;
      dStack_13e8 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                    m_storage.m_data.array[0] +
                    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                    m_storage.m_data.array[0];
      local_1420 = 0;
      uStack_13a8 = 0;
      local_1400 = 0;
      local_13d0 = dStack_13e8;
      uStack_13b8 = 0;
      dStack_1408 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                    m_storage.m_data.array[2] +
                    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                    m_storage.m_data.array[2];
      local_13c0 = dStack_1408;
      local_13a0 = dStack_1408;
      adStack_1490[3] =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[1];
      adStack_1490[4] =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[2];
      auVar167 = vshufps_avx(local_1460,local_1460,0x4e);
      dStack_1440 = (double)vmovlpd_avx(auVar167);
      auVar204._0_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[1] * 2.0;
      auVar204._8_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[2] * -2.0;
      dStack_1428 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                    m_storage.m_data.array[2];
      auStack_1418 = vshufpd_avx(auVar204,auVar204,1);
      dStack_13d8 = (double)vmovlpd_avx(auVar204);
      auVar7 = auStack_1418;
      auStack_13f8._8_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[1] * -2.0;
      auStack_13f8._0_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[0] * -2.0;
      dVar186 = auVar166._0_8_;
      local_13e0 = 0;
      uStack_13c8 = 0;
      local_13b0 = dStack_13e8;
      dStack_1398 = (double)vmovlpd_avx(auVar204);
      auVar167 = vshufpd_avx(auVar166,auVar166,1);
      lVar160 = 0x20;
      dVar257 = auVar167._0_8_;
      auVar171._8_8_ = 0;
      auVar171._0_8_ = dVar186 * dVar186 + -1.0;
      auVar220._8_8_ = 0;
      auVar220._0_8_ = dVar186 * dVar257;
      auVar167 = vunpcklpd_avx(auVar171,auVar220);
      auVar172._8_8_ = 0;
      auVar172._0_8_ = dVar257 * dVar257 + -1.0;
      auVar164 = vunpcklpd_avx(auVar220,auVar172);
      auVar173._0_8_ = dVar186 * (double)local_1380._0_8_;
      auVar173._8_8_ = auVar166._8_8_ * (double)local_1380._0_8_;
      auVar125._8_8_ = dStack_11c8;
      auVar125._0_8_ = dStack_11d0;
      dVar257 = (double)local_1380._0_8_ * (double)local_1380._0_8_ + -1.0;
      auVar166 = vsubpd_avx(auVar125,auVar86);
      auStack_ff0._0_8_ =
           local_1350 +
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[0];
      auStack_ff0._8_8_ =
           dStack_1348 +
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[1];
      dStack_fe0 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                   m_storage.m_data.array[2] + local_11e0;
      dStack_fd8 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                   m_storage.m_data.array[0] + dStack_11d8;
      auStack_fd0 = auVar166;
      auVar263 = _local_1000;
      local_fc0 = local_1340 + (double)local_1450._0_8_;
      auStack_fb8._8_8_ = dStack_1440 + local_1200;
      auStack_fb8._0_8_ = dStack_1338 + (double)local_1450._8_8_;
      dStack_fa8 = (double)auStack_1438._0_8_ + dStack_11f8;
      local_fa0 = (double)auStack_1438._8_8_ + dStack_11f0;
      dStack_f98 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                   m_storage.m_data.array[2] + dStack_11e8;
      dStack_f90 = local_1330 + 0.0;
      dStack_f88 = dStack_1328 + (double)auStack_1418._0_8_;
      local_f80 = (double)auStack_1418._8_8_ + local_1220;
      dStack_f78 = dStack_1408 + dStack_1218;
      dStack_f70 = dStack_1210 + 0.0;
      dStack_f68 = local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                   m_storage.m_data.array[0] * -2.0 + dStack_1208;
      local_f60 = local_1320 +
                  local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                  m_storage.m_data.array[1] * -2.0;
      dStack_f58 = dStack_1318 + dStack_13e8;
      dStack_f50 = local_1240 + 0.0;
      dStack_f48 = dStack_13d8 + dStack_1238;
      local_f40 = dStack_13e8 + dStack_1230;
      dStack_f38 = dStack_1228 + 0.0;
      dStack_f30 = local_1310 + dStack_1408;
      dStack_f28 = dStack_1308 + 0.0;
      local_f20 = dStack_13e8 + local_1260;
      dStack_f18 = dStack_1258 + 0.0;
      dStack_f10 = dStack_1408 + dStack_1250;
      dStack_f08 = dStack_1398 + dStack_1248;
      do {
        auVar18._8_8_ = *(undefined8 *)(local_1000 + lVar160 + -0x10);
        auVar18._0_8_ = *(undefined8 *)(local_1000 + lVar160 + -0x10);
        auVar166 = vmulpd_avx512vl(auVar167,auVar18);
        dVar186 = *(double *)(local_1000 + lVar160);
        auVar235._8_8_ = dVar186;
        auVar235._0_8_ = dVar186;
        auVar19._8_8_ = *(undefined8 *)(local_1000 + lVar160 + -8);
        auVar19._0_8_ = *(undefined8 *)(local_1000 + lVar160 + -8);
        auVar166 = vfmadd231pd_avx512vl(auVar166,auVar164,auVar19);
        auVar166 = vfmadd231pd_fma(auVar166,auVar173,auVar235);
        *(undefined1 (*) [16])(local_a20 + lVar160) = auVar166;
        auVar243._0_8_ = auVar173._0_8_ * *(double *)(local_1000 + lVar160 + -0x10);
        auVar243._8_8_ = auVar173._8_8_ * *(double *)(local_1000 + lVar160 + -8);
        auVar166 = vshufpd_avx(auVar243,auVar243,1);
        *(double *)((long)local_a10 + lVar160) = auVar243._0_8_ + auVar166._0_8_ + dVar257 * dVar186
        ;
        lVar160 = lVar160 + 0x18;
      } while (lVar160 != 0x110);
      local_1000._0_8_ =
           local_1390 +
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[0];
      local_1000._8_8_ =
           dStack_1388 +
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[1];
      auStack_ff0._0_8_ =
           local_1558 +
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[2];
      stack0xfffffffffffff018 = auVar263._24_40_;
      auVar191._0_8_ = (double)local_1000._0_8_ * auVar167._0_8_;
      auVar191._8_8_ = (double)local_1000._0_8_ * auVar167._8_8_;
      auVar20._8_8_ = local_1000._8_8_;
      auVar20._0_8_ = local_1000._8_8_;
      auVar167 = vfnmsub231pd_avx512vl(auVar191,auVar164,auVar20);
      auVar166 = vshufpd_avx(auVar173,auVar173,1);
      auVar21._8_8_ = auStack_ff0._0_8_;
      auVar21._0_8_ = auStack_ff0._0_8_;
      auVar167 = vfnmadd231pd_avx512vl(auVar167,auVar173,auVar21);
      auVar22._8_8_ = 0x8000000000000000;
      auVar22._0_8_ = 0x8000000000000000;
      auVar221._8_8_ = 0;
      auVar221._0_8_ = dVar257;
      auVar164 = vxorpd_avx512vl(auVar221,auVar22);
      local_1380._0_8_ =
           ((double)auStack_ff0._0_8_ * auVar164._0_8_ - auVar166._0_8_ * (double)local_1000._8_8_)
           - auVar173._0_8_ * (double)local_1000._0_8_;
      local_1450 = auVar251;
      auStack_1438 = auVar6;
      auStack_1418 = auVar7;
      local_12b0.m_matrix = (Matrix<double,_3,_10,_0,_3,_10> *)local_a00;
      pMStack_12a8 = (Matrix<double,_3,_10,_0,_3,_10> *)local_a00;
      memset((Matrix<double,_10,_10,_0,_10,_10> *)local_1000,0,800);
      local_ce0._0_8_ = 1.0;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,3,10,0,3,10>>,Eigen::Matrix<double,3,10,0,3,10>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,10,10,0,10,10>>
                ((Matrix<double,_10,_10,_0,_10,_10> *)local_1000,&local_12b0,
                 (Matrix<double,_3,_10,_0,_3,_10> *)local_a00,(Scalar *)local_ce0);
      local_1550 = auVar167._0_8_;
      dStack_1548 = auVar167._8_8_;
      pdVar159 = (double *)(local_a00 + 0x10);
      lVar160 = 0;
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[1] = (double)local_1000._8_8_ +
                 local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[1];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0] = (double)local_1000._0_8_ +
                 local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[0];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[2] = (double)auStack_ff0._0_8_ +
                 local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[2];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[3] = (double)auStack_ff0._8_8_ +
                 local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[3];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[4] = dStack_fe0 +
                 local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[4];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[5] = dStack_fd8 +
                 local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[5];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[6] = (double)auStack_fd0._0_8_ +
                 local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[6];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[7] = (double)auStack_fd0._8_8_ +
                 local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[7];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[8] = local_fc0 +
                 local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[8];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[9] = (double)auStack_fb8._0_8_ +
                 local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                 m_storage.m_data.array[9];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[10] = (double)auStack_fb8._8_8_ +
                  local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                  m_storage.m_data.array[10];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0xb] = dStack_fa8 +
                   local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                   m_storage.m_data.array[0xb];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0xc] = local_fa0 +
                   local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                   m_storage.m_data.array[0xc];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0xd] = dStack_f98 +
                   local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                   m_storage.m_data.array[0xd];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0xe] = dStack_f90 +
                   local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                   m_storage.m_data.array[0xe];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0xf] = dStack_f88 +
                   local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                   m_storage.m_data.array[0xf];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x10] = local_f80 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x10];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x11] = dStack_f78 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x11];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x12] = dStack_f70 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x12];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x13] = dStack_f68 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x13];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x14] = local_f60 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x14];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x15] = dStack_f58 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x15];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x16] = dStack_f50 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x16];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x17] = dStack_f48 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x17];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x18] = local_f40 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x18];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x19] = dStack_f38 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x19];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x1a] = dStack_f30 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x1a];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x1b] = dStack_f28 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x1b];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x1c] = local_f20 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x1c];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x1d] = dStack_f18 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x1d];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x1e] = dStack_f10 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x1e];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x1f] = dStack_f08 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x1f];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x20] = local_f00 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x20];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x21] = dStack_ef8 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x21];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x22] = dStack_ef0 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x22];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x23] = dStack_ee8 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x23];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x24] = local_ee0 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x24];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x25] = dStack_ed8 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x25];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x26] = dStack_ed0 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x26];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x27] = dStack_ec8 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x27];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x28] = local_ec0 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x28];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x29] = dStack_eb8 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x29];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x2a] = dStack_eb0 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x2a];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x2b] = dStack_ea8 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x2b];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x2c] = local_ea0 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x2c];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x2d] = dStack_e98 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x2d];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x2e] = dStack_e90 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x2e];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x2f] = dStack_e88 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x2f];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x30] = local_e80 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x30];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x31] = dStack_e78 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x31];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x32] = dStack_e70 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x32];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x33] = dStack_e68 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x33];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x34] = local_e60 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x34];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x35] = dStack_e58 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x35];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x36] = dStack_e50 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x36];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x37] = dStack_e48 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x37];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x38] = local_e40 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x38];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x39] = dStack_e38 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x39];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x3a] = dStack_e30 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x3a];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x3b] = dStack_e28 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x3b];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x3c] = local_e20 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x3c];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x3d] = dStack_e18 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x3d];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x3e] = dStack_e10 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x3e];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x3f] = dStack_e08 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x3f];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x40] = local_e00 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x40];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x41] = dStack_df8 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x41];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x42] = dStack_df0 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x42];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x43] = dStack_de8 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x43];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x44] = local_de0 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x44];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x45] = dStack_dd8 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x45];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x46] = dStack_dd0 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x46];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x47] = dStack_dc8 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x47];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x48] = local_dc0 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x48];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x49] = dStack_db8 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x49];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x4a] = dStack_db0 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x4a];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x4b] = dStack_da8 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x4b];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x4c] = local_da0 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x4c];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x4d] = dStack_d98 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x4d];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x4e] = dStack_d90 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x4e];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x4f] = dStack_d88 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x4f];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x50] = local_d80 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x50];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x51] = dStack_d78 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x51];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x52] = dStack_d70 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x52];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x53] = dStack_d68 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x53];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x54] = local_d60 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x54];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x55] = dStack_d58 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x55];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x56] = dStack_d50 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x56];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x57] = dStack_d48 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x57];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x58] = local_d40 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x58];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x59] = dStack_d38 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x59];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x5a] = dStack_d30 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x5a];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x5b] = dStack_d28 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x5b];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x5c] = local_d20 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x5c];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x5d] = dStack_d18 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x5d];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x5e] = dStack_d10 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x5e];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x5f] = dStack_d08 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x5f];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x60] = local_d00 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x60];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x61] = dStack_cf8 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x61];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[0x62] = dStack_cf0 +
                    local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                    m_storage.m_data.array[0x62];
      local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
      array[99] = dStack_ce8 +
                  local_660.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
                  m_storage.m_data.array[99];
      do {
        pdVar1 = pdVar159 + -2;
        pdVar85 = pdVar159 + -1;
        dVar257 = *pdVar159;
        pdVar159 = pdVar159 + 3;
        *(double *)(local_1000 + lVar160 * 8) =
             (double)local_1380._0_8_ * dVar257 + local_1550 * *pdVar1 + dStack_1548 * *pdVar85;
        lVar160 = lVar160 + 1;
      } while (lVar160 != 10);
      lVar163 = lVar163 + 1;
      local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[0] = (double)local_1000._0_8_ +
                 local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[0];
      local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[1] = (double)local_1000._8_8_ +
                 local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[1];
      local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[2] = (double)auStack_ff0._0_8_ +
                 local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[2];
      local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[3] = (double)auStack_ff0._8_8_ +
                 local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[3];
      local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[4] = dStack_fe0 +
                 local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[4];
      local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[5] = dStack_fd8 +
                 local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[5];
      local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[6] = (double)auStack_fd0._0_8_ +
                 local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[6];
      local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[7] = (double)auStack_fd0._8_8_ +
                 local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[7];
      local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[8] = local_fc0 +
                 local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[8];
      local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[9] = (double)auStack_fb8._0_8_ +
                 local_ac0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
                 m_data.array[9];
      sVar158 = indices->_numberCorrespondences;
      dVar249 = dVar249 + (double)local_1380._0_8_ * (double)local_1380._0_8_ +
                          local_1550 * local_1550 + dStack_1548 * dStack_1548;
    } while (lVar163 < (int)sVar158);
  }
  local_12d0.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_12d0.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_12d0.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (sVar158 < 5) {
    auVar263 = ZEXT1664(auVar165);
    modules::upnp_main(&local_660,&local_ac0,dVar249,&local_12d0);
  }
  else {
    auVar263 = ZEXT1664(auVar165);
    modules::upnp_main_sym(&local_660,&local_ac0,dVar249,&local_12d0);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1160.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1160.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1160.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_12d0.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_12d0.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) goto LAB_0013306e;
  uVar162 = 0;
  do {
    auVar263 = ZEXT1664(auVar263._0_16_);
    math::quaternion2rot
              (&local_12d0.
                super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar162].second);
    local_12f0._0_8_ = uVar162 * 0x40;
    modules::upnp_fill_s
              (&local_12d0.
                super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar162].second,
               (Matrix<double,_10,_1,_0,_10,_1> *)local_a00);
    auVar90._8_8_ = dStack_1348;
    auVar90._0_8_ = local_1350;
    auVar122._8_8_ = dStack_11d0;
    auVar122._0_8_ = dStack_11d8;
    auVar23._8_8_ = local_a00._0_8_;
    auVar23._0_8_ = local_a00._0_8_;
    auVar165 = vmulpd_avx512vl(auVar90,auVar23);
    auVar24._8_8_ = local_a00._8_8_;
    auVar24._0_8_ = local_a00._8_8_;
    auVar165 = vfmadd132pd_avx512vl(auVar122,auVar165,auVar24);
    auVar93._8_8_ = dStack_1338;
    auVar93._0_8_ = local_1340;
    iVar4._M_current =
         (__return_storage_ptr__->
         super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    auVar25._8_8_ = local_a00._16_8_;
    auVar25._0_8_ = local_a00._16_8_;
    auVar165 = vfmadd231pd_avx512vl(auVar165,auVar93,auVar25);
    auVar119._8_8_ = dStack_11f0;
    auVar119._0_8_ = dStack_11f8;
    auVar26._8_8_ = local_a00._24_8_;
    auVar26._0_8_ = local_a00._24_8_;
    auVar165 = vfmadd132pd_avx512vl(auVar119,auVar165,auVar26);
    auVar96._8_8_ = dStack_1328;
    auVar96._0_8_ = local_1330;
    auVar27._8_8_ = local_a00._32_8_;
    auVar27._0_8_ = local_a00._32_8_;
    auVar165 = vfmadd231pd_avx512vl(auVar165,auVar96,auVar27);
    auVar116._8_8_ = dStack_1210;
    auVar116._0_8_ = dStack_1218;
    auVar28._8_8_ = dStack_9d8;
    auVar28._0_8_ = dStack_9d8;
    auVar165 = vfmadd132pd_avx512vl(auVar116,auVar165,auVar28);
    auVar99._8_8_ = dStack_1318;
    auVar99._0_8_ = local_1320;
    auVar29._8_8_ = dStack_9d0;
    auVar29._0_8_ = dStack_9d0;
    auVar165 = vfmadd231pd_avx512vl(auVar165,auVar99,auVar29);
    auVar113._8_8_ = dStack_1230;
    auVar113._0_8_ = dStack_1238;
    auVar30._8_8_ = dStack_9c8;
    auVar30._0_8_ = dStack_9c8;
    auVar165 = vfmadd132pd_avx512vl(auVar113,auVar165,auVar30);
    auVar102._8_8_ = dStack_1308;
    auVar102._0_8_ = local_1310;
    auVar31._8_8_ = local_9c0;
    auVar31._0_8_ = local_9c0;
    auVar165 = vfmadd231pd_avx512vl(auVar165,auVar102,auVar31);
    auVar192._8_8_ = dStack_9b8;
    auVar192._0_8_ = dStack_9b8;
    auVar110._8_8_ = dStack_1250;
    auVar110._0_8_ = dStack_1258;
    auVar165 = vfmadd231pd_fma(auVar165,auVar192,auVar110);
    auVar87._8_8_ = dStack_1388;
    auVar87._0_8_ = local_1390;
    auVar165 = vsubpd_avx(auVar165,auVar87);
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [0] = auVar165._0_8_;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [1] = auVar165._8_8_;
    local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [2] = (local_11e0 * (double)local_a00._0_8_ + dStack_11c8 * (double)local_a00._8_8_ +
           local_1200 * (double)local_a00._16_8_ +
           dStack_11e8 * (double)local_a00._24_8_ + (double)local_a00._32_8_ * local_1220 +
          dStack_9d8 * dStack_1208 + dStack_9d0 * local_1240 +
          dStack_9c8 * dStack_1228 + local_9c0 * local_1260 + dStack_9b8 * dStack_1248) - local_1558
    ;
    if (iVar4._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      auVar205._8_8_ = 0;
      auVar205._0_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[8];
      auVar267._8_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[1];
      auVar267._0_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[0];
      auVar267._16_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[2];
      auVar267._24_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[3];
      auVar267._32_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[4];
      auVar267._40_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[5];
      auVar267._48_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[6];
      auVar267._56_8_ =
           local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
           m_data.array[7];
      _local_1000 = vpermpd_avx512f(_DAT_001dc4c0,auVar267);
      local_fc0 = local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                  m_storage.m_data.array[8];
      auVar32._8_8_ = 0x8000000000000000;
      auVar32._0_8_ = 0x8000000000000000;
      auVar165 = vxorpd_avx512vl(auVar205,auVar32);
      auVar222._0_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[0] * (double)local_1000._0_8_;
      auVar222._8_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[0] * (double)local_1000._8_8_;
      auVar33._8_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[1];
      auVar33._0_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[1];
      auVar166 = vfnmsub132pd_avx512vl(stack0xfffffffffffff018,auVar222,auVar33);
      auVar223._8_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[2];
      auVar223._0_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[2];
      auStack_fb8 = vfnmadd231pd_fma(auVar166,auVar223,auStack_fd0);
      dStack_fa8 = (local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                    m_storage.m_data.array[2] * auVar165._0_8_ -
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[7] *
                   local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                   m_storage.m_data.array[1]) -
                   local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.
                   m_storage.m_data.array[0] *
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[6];
      if (iVar4._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        auVar263 = ZEXT1664(auVar263._0_16_);
        std::
        vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,4,0,3,4>const&>
                  ((vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                    *)__return_storage_ptr__,iVar4,(Matrix<double,_3,_4,_0,_3,_4> *)local_1000);
      }
      else {
        ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[4] = dStack_fe0;
        ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[5] = dStack_fd8;
        ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[6] = (double)auStack_fd0._0_8_;
        ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[7] = (double)auStack_fd0._8_8_;
        ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[8] =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[8];
        ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[9] = (double)auStack_fb8._0_8_;
        ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[10] = (double)auStack_fb8._8_8_;
        ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
        .m_data.array[0xb] = dStack_fa8;
        *(undefined1 (*) [64])
         ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
         m_storage.m_data.array = _local_1000;
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
    }
    sVar158 = indices->_numberCorrespondences;
    if ((int)sVar158 < 1) {
      dVar249 = 0.0;
    }
    else {
      local_1300._0_8_ = uVar162;
      lVar163 = 0;
      iVar161 = 0;
      local_1140._8_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[1];
      local_1140._0_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[0];
      local_12e0._0_8_ =
           local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
           m_data.array[2];
      do {
        iVar156 = (int)lVar163;
        iVar157 = iVar156;
        if (indices->_useIndices != false) {
          iVar157 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar163];
        }
        auVar263 = ZEXT1664(auVar263._0_16_);
        (*adapter->_vptr_AbsoluteAdapterBase[5])
                  ((Matrix<double,_3,_4,_0,_3,_4> *)local_1000,adapter,(long)iVar157);
        iVar157 = iVar156;
        if (indices->_useIndices != false) {
          iVar157 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar163];
        }
        (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_12b0,adapter,(long)iVar157);
        auVar34._8_8_ = local_12b0.m_matrix;
        auVar34._0_8_ = local_12b0.m_matrix;
        auVar165 = vmulpd_avx512vl(local_1000,auVar34);
        auVar35._8_8_ = pMStack_12a8;
        auVar35._0_8_ = pMStack_12a8;
        auVar165 = vfmadd132pd_avx512vl(stack0xfffffffffffff018,auVar165,auVar35);
        iVar157 = iVar156;
        if (indices->_useIndices != false) {
          iVar157 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar163];
        }
        auVar174._8_8_ = dStack_12a0;
        auVar174._0_8_ = dStack_12a0;
        auVar165 = vfmadd231pd_fma(auVar165,auVar174,auStack_fd0);
        dVar249 = dStack_12a0 * local_fc0;
        dVar257 = (double)auStack_ff0._0_8_ * (double)local_12b0.m_matrix;
        local_1380._0_8_ = dStack_fd8 * (double)pMStack_12a8;
        (*adapter->_vptr_AbsoluteAdapterBase[6])
                  ((Matrix<double,_3,_4,_0,_3,_4> *)local_1000,adapter,(long)iVar157);
        if (indices->_useIndices != false) {
          iVar156 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar163];
        }
        (*adapter->_vptr_AbsoluteAdapterBase[4])(&local_12b0,adapter,(long)iVar156);
        auVar126._8_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[1];
        auVar126._0_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[0];
        auVar130._8_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[4];
        auVar130._0_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[3];
        auVar36._8_8_ = local_1000._0_8_;
        auVar36._0_8_ = local_1000._0_8_;
        auVar166 = vmulpd_avx512vl(auVar126,auVar36);
        auVar37._8_8_ = local_1000._8_8_;
        auVar37._0_8_ = local_1000._8_8_;
        auVar166 = vfmadd132pd_avx512vl(auVar130,auVar166,auVar37);
        auVar193._8_8_ = auStack_ff0._0_8_;
        auVar193._0_8_ = auStack_ff0._0_8_;
        auVar132._8_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[7];
        auVar132._0_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[6];
        auVar166 = vfmadd231pd_fma(auVar166,auVar193,auVar132);
        auVar206._0_8_ = auVar166._0_8_ + (double)local_1140._0_8_;
        auVar206._8_8_ = auVar166._8_8_ + (double)local_1140._8_8_;
        auVar105._8_8_ = pMStack_12a8;
        auVar105._0_8_ = local_12b0.m_matrix;
        auVar166 = vsubpd_avx(auVar206,auVar105);
        local_1540 = auVar165._0_8_;
        dStack_1538 = auVar165._8_8_;
        lVar163 = lVar163 + 1;
        iVar161 = iVar161 + (uint)(((local_10f0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                                     m_storage.m_data.array[2] * (double)local_1000._0_8_ +
                                     local_10f0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                                     m_storage.m_data.array[5] * (double)local_1000._8_8_ +
                                     (double)auStack_ff0._0_8_ *
                                     local_10f0.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                                     m_storage.m_data.array[8] + (double)local_12e0._0_8_) -
                                   dStack_12a0) * (dVar249 + (double)local_1380._0_8_ + dVar257) +
                                   auVar166._0_8_ * local_1540 + auVar166._8_8_ * dStack_1538 < 0.0)
        ;
        sVar158 = indices->_numberCorrespondences;
      } while (lVar163 < (int)sVar158);
      dVar249 = (double)iVar161;
      uVar162 = local_1300._0_8_;
    }
    auVar165 = vcvtusi2sd_avx512f(auVar263._0_16_,sVar158);
    auVar165 = vfmadd132sd_fma(auVar165,ZEXT816(0x3fe0000000000000),ZEXT816(0x3fc999999999999a));
    auVar165 = vroundsd_avx(auVar165,auVar165,9);
    if (dVar249 < auVar165._0_8_) {
      auVar263 = ZEXT1664(auVar263._0_16_);
      std::
      vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ::push_back(&local_1160,
                  (value_type *)
                  ((long)&((pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                          (&(local_12d0.
                             super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->second + -1))->first +
                  local_12f0._0_8_));
    }
    uVar162 = uVar162 + 1;
  } while (uVar162 < (ulong)((long)local_12d0.
                                   super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_12d0.
                                   super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
  if (local_1160.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1160.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pMVar5 = (__return_storage_ptr__->
             super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pMVar5) {
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pMVar5;
    }
    if (local_1160.
        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_1160.
        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar162 = 0;
      do {
        local_b98 = uVar162;
        math::quaternion2rot
                  (&local_1160.
                    super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar162].second);
        if ((int)indices->_numberCorrespondences < 1) {
          memset(local_a00,0,800);
          auVar165 = ZEXT816(0) << 0x40;
          auVar268 = SUB6416(ZEXT864(0),0) << 0x40;
          auVar209 = SUB6416(ZEXT864(0),0) << 0x40;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[0] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[1] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[2] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[3] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[4] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[5] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[6] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[7] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[8] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[9] = 0.0;
          auVar181 = ZEXT816(0) << 0x40;
        }
        else {
          lVar163 = 0;
          local_1540 = 0.0;
          dStack_1538 = 0.0;
          local_1550 = 0.0;
          dStack_1548 = 0.0;
          local_1380._0_16_ = ZEXT816(0);
          local_1530 = 0.0;
          dStack_1528 = 0.0;
          local_1140._0_16_ = ZEXT816(0);
          local_12e0 = ZEXT816(0);
          local_12f0 = ZEXT816(0);
          local_1300 = ZEXT816(0);
          _local_1100 = ZEXT816(0);
          local_1110 = ZEXT816(0);
          local_bb0 = 0.0;
          dStack_ba8 = 0.0;
          local_bc0 = 0.0;
          dStack_bb8 = 0.0;
          local_bd0 = 0.0;
          dStack_bc8 = 0.0;
          local_be0 = 0.0;
          dStack_bd8 = 0.0;
          local_bf0 = 0.0;
          dStack_be8 = 0.0;
          do {
            iVar156 = (int)lVar163;
            iVar161 = iVar156;
            if (indices->_useIndices == true) {
              iVar161 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar163];
            }
            (*adapter->_vptr_AbsoluteAdapterBase[5])(local_1000,adapter,(long)iVar161);
            iVar161 = iVar156;
            if (indices->_useIndices == true) {
              iVar161 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar163];
            }
            (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_10f0,adapter,(long)iVar161);
            dVar257 = local_a10[0];
            auVar167 = local_a20;
            auVar166 = local_a50;
            lVar160 = 0x18;
            auVar38._8_8_ =
                 local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array[0];
            auVar38._0_8_ =
                 local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array[0];
            auVar165 = vmulpd_avx512vl(local_1000,auVar38);
            auVar39._8_8_ =
                 local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array[1];
            auVar39._0_8_ =
                 local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array[1];
            auVar165 = vfmadd132pd_avx512vl(stack0xfffffffffffff018,auVar165,auVar39);
            auVar175._8_8_ =
                 local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array[2];
            auVar175._0_8_ =
                 local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array[2];
            auVar165 = vfmadd231pd_fma(auVar165,auVar175,auStack_fd0);
            dVar249 = (double)auStack_ff0._0_8_ *
                      local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                      m_storage.m_data.array[0] +
                      dStack_fd8 *
                      local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                      m_storage.m_data.array[1] +
                      local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                      m_storage.m_data.array[2] * local_fc0;
            dVar186 = auVar165._0_8_;
            local_1000._8_8_ = dVar186 * dVar186 + -1.0;
            auVar165 = vshufpd_avx(auVar165,auVar165,1);
            dVar201 = auVar165._0_8_;
            auStack_ff0._0_8_ = dVar186 * dVar201;
            auStack_ff0._8_8_ = dVar249 * dVar186;
            dStack_fe0 = dVar186 * dVar201;
            auVar150._8_8_ = dStack_a38;
            auVar150._0_8_ = local_a40;
            auVar165 = vmovhpd_avx(auVar150,local_a28);
            dStack_fd8 = dVar201 * dVar201 + -1.0;
            auStack_fd0._0_8_ = dVar249 * dVar201;
            auStack_fd0._8_8_ = dVar249 * dVar186;
            local_fc0 = dVar249 * dVar201;
            auStack_fb8._0_8_ = dVar249 * dVar249 + -1.0;
            auVar152._8_8_ = dStack_a30;
            auVar152._0_8_ = dStack_a38;
            do {
              auVar40._8_8_ = *(undefined8 *)(local_1000 + lVar160 + -0x10);
              auVar40._0_8_ = *(undefined8 *)(local_1000 + lVar160 + -0x10);
              auVar164 = vmulpd_avx512vl(auVar166,auVar40);
              dVar249 = *(double *)(local_1000 + lVar160);
              auVar244._8_8_ = dVar249;
              auVar244._0_8_ = dVar249;
              auVar41._8_8_ = *(undefined8 *)(local_1000 + lVar160 + -8);
              auVar41._0_8_ = *(undefined8 *)(local_1000 + lVar160 + -8);
              auVar164 = vfmadd231pd_avx512vl(auVar164,auVar152,auVar41);
              auVar164 = vfmadd231pd_fma(auVar164,auVar167,auVar244);
              *(undefined1 (*) [16])(local_1110 + lVar160 + 8) = auVar164;
              auVar253._0_8_ = auVar165._0_8_ * *(double *)(local_1000 + lVar160 + -0x10);
              auVar253._8_8_ = auVar165._8_8_ * *(double *)(local_1000 + lVar160 + -8);
              auVar164 = vshufpd_avx(auVar253,auVar253,1);
              *(double *)(local_1100 + lVar160 + 8) =
                   auVar253._0_8_ + auVar164._0_8_ + dVar249 * dVar257;
              lVar160 = lVar160 + 0x18;
            } while (lVar160 != 0x60);
            if (indices->_useIndices == true) {
              iVar156 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar163];
            }
            (*adapter->_vptr_AbsoluteAdapterBase[6])(local_1000,adapter,(long)iVar156);
            auVar106._8_8_ = pMStack_12a8;
            auVar106._0_8_ = local_12b0.m_matrix;
            lVar160 = 0x10;
            auVar42._8_8_ = local_1000._0_8_;
            auVar42._0_8_ = local_1000._0_8_;
            auVar165 = vmulpd_avx512vl(auVar106,auVar42);
            auVar43._8_8_ = local_1000._8_8_;
            auVar43._0_8_ = local_1000._8_8_;
            auVar165 = vfmadd132pd_avx512vl(auStack_1298,auVar165,auVar43);
            auVar176._8_8_ = auStack_ff0._0_8_;
            auVar176._0_8_ = auStack_ff0._0_8_;
            auVar108._8_8_ = dStack_1278;
            auVar108._0_8_ = dStack_1280;
            auVar166 = vfmadd231pd_fma(auVar165,auVar176,auVar108);
            auVar165 = vshufpd_avx(auVar166,auVar166,1);
            adStack_1490[2] = auVar166._0_8_;
            auStack_1438._0_8_ = -adStack_1490[2];
            adStack_1490[3] = auVar166._8_8_;
            auStack_1438._8_8_ = -adStack_1490[3];
            adStack_1490[5] = (double)vmovlpd_avx(auVar166);
            local_1420 = 0;
            dStack_13d8 = auVar165._0_8_ + auVar165._0_8_;
            auVar165 = vshufps_avx(auStack_1438,auStack_1438,0x4e);
            adStack_1490[4] =
                 dStack_12a0 * (double)local_1000._0_8_ +
                 dStack_1288 * (double)local_1000._8_8_ + (double)auStack_ff0._0_8_ * local_1270;
            dStack_1408 = adStack_1490[4] + adStack_1490[4];
            local_13c0 = dStack_1408;
            uStack_13a8 = 0;
            local_1450._8_8_ = adStack_1490[3];
            local_1450._0_8_ = auStack_1438._0_8_;
            local_1460._0_8_ = vmovlpd_avx(auVar165);
            dStack_13e8 = adStack_1490[2] + adStack_1490[2];
            local_1400 = 0;
            local_13d0 = dStack_13e8;
            uStack_13b8 = 0;
            local_13a0 = dStack_1408;
            auVar207._0_8_ = -adStack_1490[4];
            auVar207._8_8_ = 0x8000000000000000;
            local_1460._8_8_ = vmovlpd_avx(auVar207);
            dStack_1440 = (double)vmovlpd_avx(auVar207);
            dStack_1428 = adStack_1490[4];
            auVar44._8_8_ = 0xc000000000000000;
            auVar44._0_8_ = 0xc000000000000000;
            auStack_13f8 = vmulpd_avx512vl(auVar166,auVar44);
            auStack_1418._8_8_ = dStack_13d8;
            auStack_1418._0_8_ = adStack_1490[4] * -2.0;
            auVar131._8_8_ =
                 local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array[4];
            auVar131._0_8_ =
                 local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array[3];
            auVar133._8_8_ =
                 local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array[7];
            auVar133._0_8_ =
                 local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array[6];
            local_13e0 = 0;
            uStack_13c8 = 0;
            local_13b0 = dStack_13e8;
            auVar129._8_8_ =
                 local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array[3];
            auVar129._0_8_ =
                 local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array[2];
            dStack_1398 = dStack_13d8;
            auVar127._8_8_ =
                 local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array[1];
            auVar127._0_8_ =
                 local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage
                 .m_data.array[0];
            auVar165 = vmovhpd_avx(auVar129,local_10f0.
                                            super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>
                                            .m_storage.m_data.array[5]);
            do {
              auVar45._8_8_ = *(undefined8 *)((long)adStack_1490 + lVar160);
              auVar45._0_8_ = *(undefined8 *)((long)adStack_1490 + lVar160);
              auVar166 = vmulpd_avx512vl(auVar127,auVar45);
              dVar249 = *(double *)((long)adStack_1490 + lVar160 + 0x10);
              auVar245._8_8_ = dVar249;
              auVar245._0_8_ = dVar249;
              uVar3 = *(undefined8 *)((long)adStack_1490 + lVar160 + 8);
              auVar46._8_8_ = uVar3;
              auVar46._0_8_ = uVar3;
              auVar166 = vfmadd231pd_avx512vl(auVar166,auVar131,auVar46);
              auVar166 = vfmadd231pd_fma(auVar166,auVar133,auVar245);
              *(undefined1 (*) [16])(local_1000 + lVar160 + -0x10) = auVar166;
              auVar254._0_8_ = auVar165._0_8_ * *(double *)((long)adStack_1490 + lVar160);
              auVar254._8_8_ = auVar165._8_8_ * *(double *)((long)adStack_1490 + lVar160 + 8);
              auVar166 = vshufpd_avx(auVar254,auVar254,1);
              *(double *)(local_1000 + lVar160) =
                   auVar254._0_8_ +
                   auVar166._0_8_ +
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[8] * dVar249;
              lVar160 = lVar160 + 0x18;
            } while (lVar160 != 0x100);
            lVar163 = lVar163 + 1;
            local_bf0 = local_bf0 + (double)local_1000._0_8_;
            dStack_be8 = dStack_be8 + (double)local_1000._8_8_;
            iVar161 = (int)indices->_numberCorrespondences;
            local_be0 = local_be0 + (double)auStack_ff0._0_8_;
            dStack_bd8 = dStack_bd8 + (double)auStack_ff0._8_8_;
            local_bd0 = local_bd0 + dStack_fe0;
            dStack_bc8 = dStack_bc8 + dStack_fd8;
            local_bc0 = local_bc0 + (double)auStack_fd0._0_8_;
            dStack_bb8 = dStack_bb8 + (double)auStack_fd0._8_8_;
            local_bb0 = local_bb0 + local_fc0;
            dStack_ba8 = dStack_ba8 + (double)auStack_fb8._0_8_;
            local_1110._8_8_ = (double)local_1110._8_8_ + dStack_fa8;
            local_1110._0_8_ = (double)local_1110._0_8_ + (double)auStack_fb8._8_8_;
            dStack_10f8 = dStack_10f8 + dStack_f98;
            local_1100 = (undefined1  [8])((double)local_1100 + local_fa0);
            local_1300._8_8_ = (double)local_1300._8_8_ + dStack_f88;
            local_1300._0_8_ = (double)local_1300._0_8_ + dStack_f90;
            local_12f0._8_8_ = (double)local_12f0._8_8_ + dStack_f78;
            local_12f0._0_8_ = (double)local_12f0._0_8_ + local_f80;
            local_12e0._8_8_ = (double)local_12e0._8_8_ + dStack_f68;
            local_12e0._0_8_ = (double)local_12e0._0_8_ + dStack_f70;
            local_1140._8_8_ = (double)local_1140._8_8_ + dStack_f58;
            local_1140._0_8_ = (double)local_1140._0_8_ + local_f60;
            local_1530 = local_1530 + dStack_f50;
            dStack_1528 = dStack_1528 + dStack_f48;
            local_1380._8_8_ = (double)local_1380._8_8_ + dStack_f38;
            local_1380._0_8_ = (double)local_1380._0_8_ + local_f40;
            local_1550 = local_1550 + dStack_f30;
            dStack_1548 = dStack_1548 + dStack_f28;
            local_1540 = local_1540 + local_f20;
            dStack_1538 = dStack_1538 + dStack_f18;
          } while (lVar163 < iVar161);
          memset(local_a00,0,800);
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[0] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[1] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[2] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[3] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[4] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[5] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[6] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[7] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[8] = 0.0;
          local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data
          .array[9] = 0.0;
          if (iVar161 < 1) {
            auVar165 = ZEXT816(0) << 0x40;
            auVar181 = ZEXT816(0) << 0x40;
            auVar268 = SUB6416(ZEXT864(0),0) << 0x40;
            auVar209 = SUB6416(ZEXT864(0),0) << 0x40;
          }
          else {
            dVar261 = 0.0;
            dVar264 = 0.0;
            dVar241 = 0.0;
            dVar248 = 0.0;
            dVar202 = 0.0;
            dVar218 = 0.0;
            dVar249 = 0.0;
            dVar257 = 0.0;
            dVar186 = 0.0;
            dVar201 = 0.0;
            lVar163 = 0;
            auVar266 = stack0xfffffffffffff620;
            auVar270 = local_a00._0_32_;
            dVar219 = local_980;
            dVar230 = dStack_978;
            dVar231 = dStack_970;
            dVar232 = dStack_968;
            dVar233 = local_9a0;
            dVar238 = dStack_998;
            dVar239 = dStack_990;
            dVar240 = dStack_988;
            dVar250 = local_9c0;
            dVar258 = dStack_9b8;
            dVar259 = dStack_9b0;
            dVar260 = dStack_9a8;
            do {
              iVar156 = (int)lVar163;
              iVar161 = iVar156;
              if (indices->_useIndices == true) {
                iVar161 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                          .super__Vector_impl_data._M_start[lVar163];
              }
              local_11b0 = dVar261;
              dStack_11a8 = dVar264;
              local_11a0 = dVar241;
              dStack_1198 = dVar248;
              local_1190 = dVar202;
              dStack_1188 = dVar218;
              local_1180 = dVar186;
              dStack_1178 = dVar201;
              local_1170 = dVar249;
              dStack_1168 = dVar257;
              _local_b80 = auVar270;
              _local_b60 = auVar266;
              local_b40 = dVar250;
              dStack_b38 = dVar258;
              dStack_b30 = dVar259;
              dStack_b28 = dVar260;
              local_b20 = dVar233;
              dStack_b18 = dVar238;
              dStack_b10 = dVar239;
              dStack_b08 = dVar240;
              local_b00 = dVar219;
              dStack_af8 = dVar230;
              dStack_af0 = dVar231;
              dStack_ae8 = dVar232;
              local_340 = local_700;
              local_320 = local_720;
              local_300 = local_740;
              local_2e0 = local_760;
              local_2c0 = local_780;
              local_2a0 = local_7a0;
              local_280 = local_7c0;
              local_260 = local_7e0;
              local_240 = local_800;
              local_220 = local_840;
              local_200 = local_860;
              local_1e0 = local_8a0;
              local_1c0 = local_8e0;
              local_1a0 = local_900;
              _local_180 = local_920;
              _local_160 = local_940;
              _local_140 = local_960;
              _local_120 = local_880;
              _local_100 = local_8c0;
              _local_e0 = local_820;
              (*adapter->_vptr_AbsoluteAdapterBase[5])(local_1000,adapter,(long)iVar161);
              iVar161 = iVar156;
              if (indices->_useIndices == true) {
                iVar161 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                          .super__Vector_impl_data._M_start[lVar163];
              }
              (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_10f0,adapter,(long)iVar161);
              auVar47._8_8_ =
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[0];
              auVar47._0_8_ =
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[0];
              auVar165 = vmulpd_avx512vl(local_1000,auVar47);
              auVar48._8_8_ =
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[1];
              auVar48._0_8_ =
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[1];
              auVar165 = vfmadd132pd_avx512vl(stack0xfffffffffffff018,auVar165,auVar48);
              iVar161 = iVar156;
              if (indices->_useIndices == true) {
                iVar161 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                          .super__Vector_impl_data._M_start[lVar163];
              }
              auVar177._8_8_ =
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[2];
              auVar177._0_8_ =
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[2];
              local_c00 = vfmadd231pd_fma(auVar165,auVar177,auStack_fd0);
              local_c30 = local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                          m_storage.m_data.array[2] * local_fc0;
              local_c10._0_8_ =
                   (double)auStack_ff0._0_8_ *
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[0];
              local_c20 = dStack_fd8 *
                          local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                          m_storage.m_data.array[1];
              (*adapter->_vptr_AbsoluteAdapterBase[4])(local_ce0,adapter,(long)iVar161);
              if (indices->_useIndices == true) {
                iVar156 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                          .super__Vector_impl_data._M_start[lVar163];
              }
              (*adapter->_vptr_AbsoluteAdapterBase[6])(local_1000,adapter,(long)iVar156);
              lVar160 = 0x20;
              dVar249 = local_c30 + local_c20 + (double)local_c10._0_8_;
              auVar107._8_8_ = pMStack_12a8;
              auVar107._0_8_ = local_12b0.m_matrix;
              auVar49._8_8_ = local_1000._0_8_;
              auVar49._0_8_ = local_1000._0_8_;
              auVar165 = vmulpd_avx512vl(auVar107,auVar49);
              auVar50._8_8_ = local_1000._8_8_;
              auVar50._0_8_ = local_1000._8_8_;
              auVar165 = vfmadd132pd_avx512vl(auStack_1298,auVar165,auVar50);
              auVar178._8_8_ = auStack_ff0._0_8_;
              auVar178._0_8_ = auStack_ff0._0_8_;
              auVar109._8_8_ = dStack_1278;
              auVar109._0_8_ = dStack_1280;
              auVar166 = vfmadd231pd_fma(auVar165,auVar178,auVar109);
              auVar165 = vshufpd_avx(auVar166,auVar166,1);
              adStack_1490[2] = auVar166._0_8_;
              auStack_1438._0_8_ = -adStack_1490[2];
              adStack_1490[3] = auVar166._8_8_;
              auStack_1438._8_8_ = -adStack_1490[3];
              adStack_1490[5] = (double)vmovlpd_avx(auVar166);
              local_1420 = 0;
              dStack_13d8 = auVar165._0_8_ + auVar165._0_8_;
              adStack_1490[4] =
                   dStack_12a0 * (double)local_1000._0_8_ +
                   dStack_1288 * (double)local_1000._8_8_ + (double)auStack_ff0._0_8_ * local_1270;
              dStack_1408 = adStack_1490[4] + adStack_1490[4];
              local_13c0 = dStack_1408;
              uStack_13a8 = 0;
              local_1450._8_8_ = adStack_1490[3];
              local_1450._0_8_ = auStack_1438._0_8_;
              auVar165 = vshufps_avx(auStack_1438,auStack_1438,0x4e);
              local_1460._0_8_ = vmovlpd_avx(auVar165);
              dStack_13e8 = adStack_1490[2] + adStack_1490[2];
              local_1400 = 0;
              local_13d0 = dStack_13e8;
              uStack_13b8 = 0;
              local_13a0 = dStack_1408;
              auVar224._0_8_ = -adStack_1490[4];
              auVar224._8_8_ = 0x8000000000000000;
              local_1460._8_8_ = vmovlpd_avx(auVar224);
              dStack_1440 = (double)vmovlpd_avx(auVar224);
              dStack_1428 = adStack_1490[4];
              auVar51._8_8_ = 0xc000000000000000;
              auVar51._0_8_ = 0xc000000000000000;
              auStack_13f8 = vmulpd_avx512vl(auVar166,auVar51);
              auStack_1418._8_8_ = dStack_13d8;
              auStack_1418._0_8_ = adStack_1490[4] * -2.0;
              auVar167 = auStack_13f8;
              local_13e0 = 0;
              uStack_13c8 = 0;
              local_13b0 = dStack_13e8;
              dStack_1398 = dStack_13d8;
              auVar165 = vshufpd_avx(local_c00,local_c00,1);
              dVar186 = local_c00._0_8_;
              dVar257 = auVar165._0_8_;
              local_c10._0_8_ = dVar186 * dVar249;
              local_c10._8_8_ = local_c00._8_8_ * dVar249;
              local_c20 = dVar249 * dVar249 + -1.0;
              auVar179._8_8_ = 0;
              auVar179._0_8_ = dVar186 * dVar186 + -1.0;
              auVar225._8_8_ = 0;
              auVar225._0_8_ = dVar186 * dVar257;
              auVar165 = vunpcklpd_avx(auVar179,auVar225);
              auVar194._8_8_ = 0;
              auVar194._0_8_ = dVar257 * dVar257 + -1.0;
              auVar166 = vunpcklpd_avx(auVar225,auVar194);
              auStack_ff0._0_8_ = local_bf0 + adStack_1490[2];
              auStack_ff0._8_8_ = dStack_be8 + adStack_1490[3];
              dStack_fe0 = local_be0 + adStack_1490[4];
              dStack_fd8 = dStack_bd8 + adStack_1490[5];
              auStack_fd0._0_8_ = local_bd0 + (double)local_1460._0_8_;
              auStack_fd0._8_8_ = dStack_bc8 + (double)local_1460._8_8_;
              local_fc0 = local_bc0 + (double)auStack_1438._0_8_;
              auStack_fb8._8_8_ = local_bb0 + dStack_1440;
              auStack_fb8._0_8_ = dStack_bb8 + adStack_1490[3];
              dStack_fa8 = dStack_ba8 + (double)auStack_1438._0_8_;
              local_fa0 = (double)local_1110._0_8_ + (double)auStack_1438._8_8_;
              dStack_f98 = (double)local_1110._8_8_ + adStack_1490[4];
              dStack_f90 = (double)local_1100 + 0.0;
              dStack_f88 = dStack_10f8 + adStack_1490[4] * -2.0;
              local_f80 = (double)local_1300._0_8_ + dStack_13d8;
              dStack_f78 = (double)local_1300._8_8_ + dStack_1408;
              dStack_f70 = (double)local_12f0._0_8_ + 0.0;
              dStack_f68 = (double)local_12f0._8_8_ + (double)auStack_13f8._0_8_;
              local_f60 = (double)local_12e0._0_8_ + (double)auStack_13f8._8_8_;
              dStack_f58 = (double)local_12e0._8_8_ + dStack_13e8;
              dStack_f50 = (double)local_1140._0_8_ + 0.0;
              dStack_f48 = (double)local_1140._8_8_ + dStack_13d8;
              local_f40 = local_1530 + dStack_13e8;
              dStack_f38 = dStack_1528 + 0.0;
              dStack_f30 = (double)local_1380._0_8_ + dStack_1408;
              dStack_f28 = (double)local_1380._8_8_ + 0.0;
              local_f20 = local_1550 + dStack_13e8;
              dStack_f18 = dStack_1548 + 0.0;
              dStack_f10 = local_1540 + dStack_1408;
              dStack_f08 = dStack_1538 + dStack_13d8;
              do {
                auVar52._8_8_ = *(undefined8 *)(local_1000 + lVar160 + -0x10);
                auVar52._0_8_ = *(undefined8 *)(local_1000 + lVar160 + -0x10);
                auVar164 = vmulpd_avx512vl(auVar165,auVar52);
                dVar249 = *(double *)(local_1000 + lVar160);
                auVar208._8_8_ = dVar249;
                auVar208._0_8_ = dVar249;
                auVar53._8_8_ = *(undefined8 *)(local_1000 + lVar160 + -8);
                auVar53._0_8_ = *(undefined8 *)(local_1000 + lVar160 + -8);
                auVar164 = vfmadd231pd_avx512vl(auVar164,auVar166,auVar53);
                auVar164 = vfmadd231pd_fma(auVar164,local_c10,auVar208);
                *(undefined1 (*) [16])(local_1110 + lVar160) = auVar164;
                auVar226._0_8_ = (double)local_c10._0_8_ * *(double *)(local_1000 + lVar160 + -0x10)
                ;
                auVar226._8_8_ = (double)local_c10._8_8_ * *(double *)(local_1000 + lVar160 + -8);
                auVar164 = vshufpd_avx(auVar226,auVar226,1);
                *(double *)(local_1100 + lVar160) =
                     auVar226._0_8_ + auVar164._0_8_ + local_c20 * dVar249;
                auVar263 = _local_1000;
                lVar160 = lVar160 + 0x18;
              } while (lVar160 != 0x110);
              dStack_c18 = 0.0;
              local_c30 = local_1390 + (double)local_ce0._0_8_;
              dStack_c28 = dStack_1388 + (double)local_ce0._8_8_;
              local_b88 = local_1558 + (double)local_ce0._16_8_;
              local_1000._8_8_ = dStack_c28;
              local_1000._0_8_ = local_c30;
              stack0xfffffffffffff018 = auVar263._24_40_;
              auStack_ff0._0_8_ = local_b88;
              auVar180._0_8_ = local_c30 * auVar165._0_8_;
              auVar180._8_8_ = local_c30 * auVar165._8_8_;
              auVar54._8_8_ = dStack_c28;
              auVar54._0_8_ = dStack_c28;
              auVar165 = vfnmsub231pd_avx512vl(auVar180,auVar166,auVar54);
              auVar55._8_8_ = local_b88;
              auVar55._0_8_ = local_b88;
              local_c00 = vfnmadd231pd_avx512vl(auVar165,local_c10,auVar55);
              auVar165 = vshufpd_avx(local_c10,local_c10,1);
              local_b90 = auVar165._0_8_ * dStack_c28;
              auStack_13f8 = auVar167;
              local_ce0._96_8_ = &local_10f0;
              pMStack_c78 = &local_10f0;
              memset((Matrix<double,_10,_10,_0,_10,_10> *)local_1000,0,800);
              local_6e0.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
              m_data.array[0] = 1.0;
              Eigen::internal::
              generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,3,10,0,3,10>>,Eigen::Matrix<double,3,10,0,3,10>,Eigen::DenseShape,Eigen::DenseShape,8>
              ::scaleAndAddTo<Eigen::Matrix<double,10,10,0,10,10>>
                        ((Matrix<double,_10,_10,_0,_10,_10> *)local_1000,
                         (Transpose<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)(local_ce0 + 0x60),
                         &local_10f0,(Scalar *)&local_6e0);
              auVar148._8_8_ = dStack_c18;
              auVar148._0_8_ = local_c20;
              pdVar159 = local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                         m_storage.m_data.array + 2;
              lVar160 = 0;
              auVar56._8_8_ = 0x8000000000000000;
              auVar56._0_8_ = 0x8000000000000000;
              auVar165 = vxorpd_avx512vl(auVar148,auVar56);
              local_960._0_8_ = (double)local_140._0_8_ + local_f60;
              local_960._8_8_ = (double)local_140._8_8_ + dStack_f58;
              local_960._16_8_ = dStack_130 + dStack_f50;
              local_960._24_8_ = dStack_128 + dStack_f48;
              auVar270._0_8_ = (double)local_b80._0_8_ + (double)local_1000._0_8_;
              auVar270._8_8_ = (double)local_b80._8_8_ + (double)local_1000._8_8_;
              auVar270._16_8_ = dStack_b70 + (double)auStack_ff0._0_8_;
              auVar270._24_8_ = dStack_b68 + (double)auStack_ff0._8_8_;
              auVar266._0_8_ = (double)local_b60._0_8_ + dStack_fe0;
              auVar266._8_8_ = (double)local_b60._8_8_ + dStack_fd8;
              auVar266._16_8_ = dStack_b50 + (double)auStack_fd0._0_8_;
              auVar266._24_8_ = dStack_b48 + (double)auStack_fd0._8_8_;
              dVar250 = local_b40 + local_fc0;
              dVar258 = dStack_b38 + (double)auStack_fb8._0_8_;
              dVar259 = dStack_b30 + (double)auStack_fb8._8_8_;
              dVar260 = dStack_b28 + dStack_fa8;
              dVar233 = local_b20 + local_fa0;
              dVar238 = dStack_b18 + dStack_f98;
              dVar239 = dStack_b10 + dStack_f90;
              dVar240 = dStack_b08 + dStack_f88;
              dVar219 = local_b00 + local_f80;
              dVar230 = dStack_af8 + dStack_f78;
              dVar231 = dStack_af0 + dStack_f70;
              dVar232 = dStack_ae8 + dStack_f68;
              local_940._0_8_ = (double)local_160._0_8_ + local_f40;
              local_940._8_8_ = (double)local_160._8_8_ + dStack_f38;
              local_940._16_8_ = dStack_150 + dStack_f30;
              local_940._24_8_ = dStack_148 + dStack_f28;
              local_920._0_8_ = (double)local_180._0_8_ + local_f20;
              local_920._8_8_ = (double)local_180._8_8_ + dStack_f18;
              local_920._16_8_ = dStack_170 + dStack_f10;
              local_920._24_8_ = dStack_168 + dStack_f08;
              auVar134._8_8_ = dStack_ef8;
              auVar134._0_8_ = local_f00;
              auVar134._16_8_ = dStack_ef0;
              auVar134._24_8_ = dStack_ee8;
              local_900 = vaddpd_avx512vl(local_1a0,auVar134);
              auVar135._8_8_ = dStack_ed8;
              auVar135._0_8_ = local_ee0;
              auVar135._16_8_ = dStack_ed0;
              auVar135._24_8_ = dStack_ec8;
              local_8e0 = vaddpd_avx512vl(local_1c0,auVar135);
              auVar272._0_8_ = (double)local_100._0_8_ + local_ec0;
              auVar272._8_8_ = (double)local_100._8_8_ + dStack_eb8;
              local_8c0._16_8_ = dStack_f0 + dStack_eb0;
              local_8c0._0_16_ = auVar272;
              local_8c0._24_8_ = dStack_e8 + dStack_ea8;
              auVar136._8_8_ = dStack_e98;
              auVar136._0_8_ = local_ea0;
              auVar136._16_8_ = dStack_e90;
              auVar136._24_8_ = dStack_e88;
              local_8a0 = vaddpd_avx512vl(local_1e0,auVar136);
              local_880._0_8_ = (double)local_120._0_8_ + local_e80;
              local_880._8_8_ = (double)local_120._8_8_ + dStack_e78;
              local_880._16_8_ = dStack_110 + dStack_e70;
              local_880._24_8_ = dStack_108 + dStack_e68;
              auVar137._8_8_ = dStack_e58;
              auVar137._0_8_ = local_e60;
              auVar137._16_8_ = dStack_e50;
              auVar137._24_8_ = dStack_e48;
              local_860 = vaddpd_avx512vl(local_200,auVar137);
              auVar138._8_8_ = dStack_e38;
              auVar138._0_8_ = local_e40;
              auVar138._16_8_ = dStack_e30;
              auVar138._24_8_ = dStack_e28;
              local_840 = vaddpd_avx512vl(local_220,auVar138);
              auVar268._0_8_ = (double)local_e0._0_8_ + local_e20;
              auVar268._8_8_ = (double)local_e0._8_8_ + dStack_e18;
              local_820._16_8_ = dStack_d0 + dStack_e10;
              local_820._0_16_ = auVar268;
              local_820._24_8_ = dStack_c8 + dStack_e08;
              auVar139._8_8_ = dStack_df8;
              auVar139._0_8_ = local_e00;
              auVar139._16_8_ = dStack_df0;
              auVar139._24_8_ = dStack_de8;
              local_800 = vaddpd_avx512vl(local_240,auVar139);
              auVar140._8_8_ = dStack_dd8;
              auVar140._0_8_ = local_de0;
              auVar140._16_8_ = dStack_dd0;
              auVar140._24_8_ = dStack_dc8;
              local_7e0 = vaddpd_avx512vl(local_260,auVar140);
              auVar141._8_8_ = dStack_db8;
              auVar141._0_8_ = local_dc0;
              auVar141._16_8_ = dStack_db0;
              auVar141._24_8_ = dStack_da8;
              local_7c0 = vaddpd_avx512vl(local_280,auVar141);
              auVar142._8_8_ = dStack_d98;
              auVar142._0_8_ = local_da0;
              auVar142._16_8_ = dStack_d90;
              auVar142._24_8_ = dStack_d88;
              local_7a0 = vaddpd_avx512vl(local_2a0,auVar142);
              auVar143._8_8_ = dStack_d78;
              auVar143._0_8_ = local_d80;
              auVar143._16_8_ = dStack_d70;
              auVar143._24_8_ = dStack_d68;
              local_780 = vaddpd_avx512vl(local_2c0,auVar143);
              auVar144._8_8_ = dStack_d58;
              auVar144._0_8_ = local_d60;
              auVar144._16_8_ = dStack_d50;
              auVar144._24_8_ = dStack_d48;
              local_760 = vaddpd_avx512vl(local_2e0,auVar144);
              auVar145._8_8_ = dStack_d38;
              auVar145._0_8_ = local_d40;
              auVar145._16_8_ = dStack_d30;
              auVar145._24_8_ = dStack_d28;
              local_740 = vaddpd_avx512vl(local_300,auVar145);
              auVar146._8_8_ = dStack_d18;
              auVar146._0_8_ = local_d20;
              auVar146._16_8_ = dStack_d10;
              auVar146._24_8_ = dStack_d08;
              local_720 = vaddpd_avx512vl(local_320,auVar146);
              auVar147._8_8_ = dStack_cf8;
              auVar147._0_8_ = local_d00;
              auVar147._16_8_ = dStack_cf0;
              auVar147._24_8_ = dStack_ce8;
              local_700 = vaddpd_avx512vl(local_340,auVar147);
              do {
                ppVar2 = (plain_array<double,_30,_0,_16> *)(pdVar159 + -2);
                pdVar1 = pdVar159 + -1;
                dVar249 = *pdVar159;
                pdVar159 = pdVar159 + 3;
                *(double *)(local_1000 + lVar160 * 8) =
                     ((auVar165._0_8_ * local_b88 - local_b90) - local_c30 * (double)local_c10._0_8_
                     ) * dVar249 +
                     (double)local_c00._0_8_ * ppVar2->array[0] + (double)local_c00._8_8_ * *pdVar1;
                lVar160 = lVar160 + 1;
              } while (lVar160 != 10);
              lVar163 = lVar163 + 1;
              dVar261 = local_11b0 + (double)local_1000._0_8_;
              dVar264 = dStack_11a8 + (double)local_1000._8_8_;
              dVar241 = local_11a0 + (double)auStack_ff0._0_8_;
              dVar248 = dStack_1198 + (double)auStack_ff0._8_8_;
              dVar202 = local_1190 + dStack_fe0;
              dVar218 = dStack_1188 + dStack_fd8;
              dVar249 = local_1170 + (double)auStack_fd0._0_8_;
              dVar257 = dStack_1168 + (double)auStack_fd0._8_8_;
              dVar186 = local_1180 + local_fc0;
              dVar201 = dStack_1178 + (double)auStack_fb8._0_8_;
            } while (lVar163 < (int)indices->_numberCorrespondences);
            auVar209._0_8_ = dVar202 + dVar202;
            auVar209._8_8_ = dVar218 + dVar218;
            auVar181._8_8_ = 0;
            auVar181._0_8_ = dVar249 + dVar249;
            auVar165 = vunpcklpd_avx(auVar272,local_880._16_16_);
            local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[0] = dVar261;
            local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[1] = dVar264;
            local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[2] = dVar241;
            local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[3] = dVar248;
            local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[4] = dVar202;
            local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[5] = dVar218;
            local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[6] = dVar249;
            local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[7] = dVar257;
            local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[8] = dVar186;
            local_1500.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.
            m_data.array[9] = dVar201;
            local_a00._0_32_ = auVar270;
            unique0x1000a139 = auVar266;
            local_9c0 = dVar250;
            dStack_9b8 = dVar258;
            dStack_9b0 = dVar259;
            dStack_9a8 = dVar260;
            local_9a0 = dVar233;
            dStack_998 = dVar238;
            dStack_990 = dVar239;
            dStack_988 = dVar240;
            local_980 = dVar219;
            dStack_978 = dVar230;
            dStack_970 = dVar231;
            dStack_968 = dVar232;
          }
        }
        auVar57._8_8_ = 0x4000000000000000;
        auVar57._0_8_ = 0x4000000000000000;
        local_690 = vfmadd132pd_avx512vl(auVar165,auVar209,auVar57);
        auVar165 = vfmadd231sd_fma(auVar181,auVar268,ZEXT816(0x4000000000000000));
        local_680 = auVar165._0_8_;
        Jac((Matrix<double,_10,_10,_0,_10,_10> *)local_a00,&local_1500,local_680,
            (Matrix3d *)local_ce0);
        local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (double *)0x0;
        local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (double *)0x0;
        local_1000._0_8_ = (XprTypeNested)0xbff0000000000000;
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_1520,(iterator)0x0,(double *)local_1000);
        local_1000._0_8_ =
             (double)local_ce0._64_8_ + (double)local_ce0._32_8_ + (double)local_ce0._0_8_;
        if (local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_1520,
                     (iterator)
                     local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)local_1000);
        }
        else {
          *local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)local_1000._0_8_;
          local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        auVar182._8_8_ = 0;
        auVar182._0_8_ = local_ce0._64_8_;
        auVar210._8_8_ = 0;
        auVar210._0_8_ = local_ce0._0_8_;
        auVar195._8_8_ = 0;
        auVar195._0_8_ = local_ce0._32_8_;
        auVar236._8_8_ = 0;
        auVar236._0_8_ = (double)local_ce0._0_8_ * (double)local_ce0._64_8_;
        auVar165 = vfnmsub231sd_fma(auVar236,auVar195,auVar182);
        auVar165 = vfnmadd231sd_fma(auVar165,auVar195,auVar210);
        local_1000._0_8_ =
             (double)local_ce0._24_8_ * (double)local_ce0._24_8_ +
             (double)local_ce0._48_8_ * (double)local_ce0._48_8_ +
             (double)local_ce0._56_8_ * (double)local_ce0._56_8_ + auVar165._0_8_;
        if (local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_1520,
                     (iterator)
                     local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)local_1000);
        }
        else {
          *local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)local_1000._0_8_;
          local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        auVar183._8_8_ = 0;
        auVar183._0_8_ = local_ce0._64_8_;
        auVar196._8_8_ = 0;
        auVar196._0_8_ = local_ce0._32_8_;
        auVar255._8_8_ = 0;
        auVar255._0_8_ = local_ce0._0_8_;
        auVar211._8_8_ = 0;
        auVar211._0_8_ = (double)local_ce0._64_8_ * (double)local_ce0._32_8_;
        auVar246._8_8_ = 0;
        auVar246._0_8_ =
             ((double)local_ce0._56_8_ + (double)local_ce0._56_8_) * (double)local_ce0._48_8_ *
             (double)local_ce0._24_8_;
        auVar165 = vfmadd231sd_fma(auVar246,auVar255,auVar211);
        auVar212._8_8_ = 0;
        auVar212._0_8_ = (double)local_ce0._24_8_ * (double)local_ce0._24_8_;
        auVar165 = vfnmadd213sd_fma(auVar212,auVar183,auVar165);
        auVar227._8_8_ = 0;
        auVar227._0_8_ = (double)local_ce0._56_8_ * (double)local_ce0._56_8_;
        auVar165 = vfnmadd213sd_fma(auVar227,auVar255,auVar165);
        auVar184._8_8_ = 0;
        auVar184._0_8_ = (double)local_ce0._48_8_ * (double)local_ce0._48_8_;
        auVar165 = vfnmadd213sd_fma(auVar184,auVar196,auVar165);
        local_1000._0_8_ = auVar165._0_8_;
        if (local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_1520,
                     (iterator)
                     local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)local_1000);
        }
        else {
          *local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = auVar165._0_8_;
          local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        math::o3_roots(&local_678,&local_1520);
        local_ce0._96_8_ = local_ce0;
        pdStack_c70 = (double *)local_690;
        local_1000._8_8_ = (Matrix<double,_3,_3,_0,_3,_3> *)(local_1000 + 0x10);
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run((Matrix<double,_3,_3,_0,_3,_3> *)(local_1000 + 0x10),(SrcXprType *)(local_ce0 + 0x60),
              (assign_op<double,_double> *)&local_10f0);
        auVar197._0_8_ = -*(double *)*(undefined1 (*) [16])(local_1000._8_8_ + 0x10);
        auVar197._8_8_ = -*(double *)(*(undefined1 (*) [16])(local_1000._8_8_ + 0x10) + 8);
        auVar213._0_8_ = -*(double *)*(undefined1 (*) [16])(local_1000._8_8_ + 0x20);
        auVar213._8_8_ = -*(double *)(*(undefined1 (*) [16])(local_1000._8_8_ + 0x20) + 8);
        auVar58._8_8_ = *pdStack_c70;
        auVar58._0_8_ = *pdStack_c70;
        auVar165 = vmulpd_avx512vl(*(undefined1 (*) [16])local_1000._8_8_,auVar58);
        auVar128._8_8_ = auVar213._0_8_;
        auVar128._0_8_ = auVar197._8_8_;
        auVar59._8_8_ = pdStack_c70[1];
        auVar59._0_8_ = pdStack_c70[1];
        auVar166 = vfmsub132pd_avx512vl(auVar128,auVar165,auVar59);
        auVar165 = vblendpd_avx(auVar197,auVar213,2);
        auVar60._8_8_ = pdStack_c70[2];
        auVar60._0_8_ = pdStack_c70[2];
        local_6b0 = vfnmadd231pd_avx512vl
                              (auVar166,*(undefined1 (*) [16])(local_1000._8_8_ + 0x30),auVar60);
        auVar185._0_8_ = auVar165._0_8_ * *pdStack_c70;
        auVar185._8_8_ = auVar165._8_8_ * pdStack_c70[1];
        auVar165 = vshufpd_avx(auVar185,auVar185,1);
        local_6a0 = auVar185._0_8_ +
                    (auVar165._0_8_ -
                    *(double *)*(undefined1 (*) [16])(local_1000._8_8_ + 0x40) * pdStack_c70[2]);
        local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
        array[0] = auVar197._0_8_;
        local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
        array[1] = auVar197._8_8_;
        local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
        array[2] = auVar213._0_8_;
        local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
        array[3] = auVar213._8_8_;
        math::cayley2rot((cayley_t *)local_6b0);
        auVar165 = auStack_ff0;
        lVar163 = 0x10;
        auVar165 = vmovhpd_avx(auVar165,dStack_fd8);
        do {
          uVar3 = *(undefined8 *)
                   ((long)&local_12d0.
                           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar163);
          auVar61._8_8_ = uVar3;
          auVar61._0_8_ = uVar3;
          auVar166 = vmulpd_avx512vl(local_1000,auVar61);
          dVar249 = *(double *)((long)&local_12b0.m_matrix + lVar163);
          auVar247._8_8_ = dVar249;
          auVar247._0_8_ = dVar249;
          auVar62._8_8_ = *(undefined8 *)((long)&dStack_12b8 + lVar163);
          auVar62._0_8_ = *(undefined8 *)((long)&dStack_12b8 + lVar163);
          auVar166 = vfmadd231pd_avx512vl(auVar166,stack0xfffffffffffff018,auVar62);
          auVar166 = vfmadd231pd_fma(auVar166,auStack_fd0,auVar247);
          *(undefined1 (*) [16])(local_ce0 + lVar163 + 0x50) = auVar166;
          auVar256._0_8_ =
               auVar165._0_8_ *
               *(double *)
                ((long)&local_12d0.
                        super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar163);
          auVar256._8_8_ = auVar165._8_8_ * *(double *)((long)&dStack_12b8 + lVar163);
          auVar166 = vshufpd_avx(auVar256,auVar256,1);
          *(double *)(local_ce0 + lVar163 + 0x60) =
               auVar256._0_8_ + auVar166._0_8_ + dVar249 * local_fc0;
          lVar163 = lVar163 + 0x18;
        } while (lVar163 != 0x58);
        math::rot2quaternion(&local_6e0,(rotation_t *)(local_ce0 + 0x60));
        modules::upnp_fill_s(&local_6e0,(Matrix<double,_10,_1,_0,_10,_1> *)&local_10f0);
        auVar91._8_8_ = dStack_1348;
        auVar91._0_8_ = local_1350;
        auVar123._8_8_ = dStack_11d0;
        auVar123._0_8_ = dStack_11d8;
        auVar63._8_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[0];
        auVar63._0_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[0];
        auVar165 = vmulpd_avx512vl(auVar91,auVar63);
        auVar64._8_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[1];
        auVar64._0_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[1];
        auVar165 = vfmadd132pd_avx512vl(auVar123,auVar165,auVar64);
        auVar94._8_8_ = dStack_1338;
        auVar94._0_8_ = local_1340;
        iVar4._M_current =
             (__return_storage_ptr__->
             super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        auVar65._8_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[2];
        auVar65._0_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[2];
        auVar165 = vfmadd231pd_avx512vl(auVar165,auVar94,auVar65);
        auVar120._8_8_ = dStack_11f0;
        auVar120._0_8_ = dStack_11f8;
        auVar66._8_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[3];
        auVar66._0_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[3];
        auVar165 = vfmadd132pd_avx512vl(auVar120,auVar165,auVar66);
        auVar97._8_8_ = dStack_1328;
        auVar97._0_8_ = local_1330;
        auVar67._8_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[4];
        auVar67._0_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[4];
        auVar165 = vfmadd231pd_avx512vl(auVar165,auVar97,auVar67);
        auVar117._8_8_ = dStack_1210;
        auVar117._0_8_ = dStack_1218;
        auVar68._8_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[5];
        auVar68._0_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[5];
        auVar165 = vfmadd132pd_avx512vl(auVar117,auVar165,auVar68);
        auVar100._8_8_ = dStack_1318;
        auVar100._0_8_ = local_1320;
        auVar69._8_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[6];
        auVar69._0_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[6];
        auVar165 = vfmadd231pd_avx512vl(auVar165,auVar100,auVar69);
        auVar114._8_8_ = dStack_1230;
        auVar114._0_8_ = dStack_1238;
        auVar70._8_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[7];
        auVar70._0_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[7];
        auVar165 = vfmadd132pd_avx512vl(auVar114,auVar165,auVar70);
        auVar103._8_8_ = dStack_1308;
        auVar103._0_8_ = local_1310;
        auVar71._8_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[8];
        auVar71._0_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[8];
        auVar165 = vfmadd231pd_avx512vl(auVar165,auVar103,auVar71);
        auVar198._8_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[9];
        auVar198._0_8_ =
             local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
             m_data.array[9];
        auVar111._8_8_ = dStack_1250;
        auVar111._0_8_ = dStack_1258;
        auVar165 = vfmadd231pd_fma(auVar165,auVar198,auVar111);
        auVar88._8_8_ = dStack_1388;
        auVar88._0_8_ = local_1390;
        local_ae0 = vsubpd_avx(auVar165,auVar88);
        dVar249 = local_ae0._0_8_;
        local_ad0 = (local_11e0 *
                     local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                     m_storage.m_data.array[0] +
                     dStack_11c8 *
                     local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                     m_storage.m_data.array[1] +
                     local_1200 *
                     local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                     m_storage.m_data.array[2] +
                     dStack_11e8 *
                     local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                     m_storage.m_data.array[3] +
                     local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                     m_storage.m_data.array[4] * local_1220 +
                    local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                    m_storage.m_data.array[5] * dStack_1208 +
                    local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                    m_storage.m_data.array[6] * local_1240 +
                    local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                    m_storage.m_data.array[7] * dStack_1228 +
                    local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                    m_storage.m_data.array[8] * local_1260 +
                    local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                    m_storage.m_data.array[9] * dStack_1248) - local_1558;
        auVar214._8_8_ = 0;
        auVar214._0_8_ = local_c40;
        auVar263._8_8_ = pMStack_c78;
        auVar263._0_8_ = local_ce0._96_8_;
        auVar263._16_8_ = pdStack_c70;
        auVar263._24_24_ = auStack_c68;
        auVar263._48_8_ = dStack_c50;
        auVar263._56_8_ = dStack_c48;
        _local_1000 = vpermpd_avx512f(_DAT_001dc4c0,auVar263);
        local_fc0 = local_c40;
        auVar72._8_8_ = 0x8000000000000000;
        auVar72._0_8_ = 0x8000000000000000;
        auVar165 = vxorpd_avx512vl(auVar214,auVar72);
        auVar228._0_8_ = dVar249 * (double)local_1000._0_8_;
        auVar228._8_8_ = dVar249 * (double)local_1000._8_8_;
        auVar73._8_8_ = local_ae0._8_8_;
        auVar73._0_8_ = local_ae0._8_8_;
        auVar166 = vfnmsub132pd_avx512vl(stack0xfffffffffffff018,auVar228,auVar73);
        auVar229._8_8_ = local_ad0;
        auVar229._0_8_ = local_ad0;
        auStack_fb8 = vfnmadd231pd_fma(auVar166,auVar229,auStack_fd0);
        dStack_fa8 = (local_ad0 * auVar165._0_8_ - dStack_c48 * (double)local_ae0._8_8_) -
                     dVar249 * dStack_c50;
        if (iVar4._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
          ::_M_realloc_insert<Eigen::Matrix<double,3,4,0,3,4>const&>
                    ((vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                      *)__return_storage_ptr__,iVar4,(Matrix<double,_3,_4,_0,_3,_4> *)local_1000);
        }
        else {
          ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[4] = dStack_fe0;
          ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[5] = dStack_fd8;
          ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[6] = (double)auStack_fd0._0_8_;
          ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[7] = (double)auStack_fd0._8_8_;
          ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[8] = local_c40;
          ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[9] = (double)auStack_fb8._0_8_;
          ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[10] = (double)auStack_fb8._8_8_;
          ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
          m_storage.m_data.array[0xb] = dStack_fa8;
          *(undefined1 (*) [64])
           ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
           m_storage.m_data.array = _local_1000;
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        if (local_678.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_678.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1520.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar162 = local_b98 + 1;
      } while (uVar162 < (ulong)((long)local_1160.
                                       super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_1160.
                                       super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 6));
      if ((__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_finish !=
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_start) goto LAB_00133055;
    }
    local_ce0._0_8_ =
         ((local_1160.
           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).
         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
    local_ce0._8_8_ =
         ((local_1160.
           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).
         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
    local_ce0._16_8_ =
         ((local_1160.
           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).
         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
    local_ce0._24_8_ =
         ((local_1160.
           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second).
         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
    modules::upnp_fill_s((Vector4d *)local_ce0,(Matrix<double,_10,_1,_0,_10,_1> *)&local_10f0);
    auVar92._8_8_ = dStack_1348;
    auVar92._0_8_ = local_1350;
    auVar124._8_8_ = dStack_11d0;
    auVar124._0_8_ = dStack_11d8;
    auVar74._8_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[0];
    auVar74._0_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[0];
    auVar165 = vmulpd_avx512vl(auVar92,auVar74);
    auVar75._8_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[1];
    auVar75._0_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[1];
    auVar165 = vfmadd132pd_avx512vl(auVar124,auVar165,auVar75);
    auVar95._8_8_ = dStack_1338;
    auVar95._0_8_ = local_1340;
    auVar76._8_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[2];
    auVar76._0_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[2];
    auVar165 = vfmadd231pd_avx512vl(auVar165,auVar95,auVar76);
    auVar121._8_8_ = dStack_11f0;
    auVar121._0_8_ = dStack_11f8;
    auVar77._8_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[3];
    auVar77._0_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[3];
    auVar165 = vfmadd132pd_avx512vl(auVar121,auVar165,auVar77);
    auVar98._8_8_ = dStack_1328;
    auVar98._0_8_ = local_1330;
    auVar78._8_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[4];
    auVar78._0_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[4];
    auVar165 = vfmadd231pd_avx512vl(auVar165,auVar98,auVar78);
    auVar118._8_8_ = dStack_1210;
    auVar118._0_8_ = dStack_1218;
    auVar79._8_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[5];
    auVar79._0_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[5];
    auVar165 = vfmadd132pd_avx512vl(auVar118,auVar165,auVar79);
    auVar101._8_8_ = dStack_1318;
    auVar101._0_8_ = local_1320;
    auVar80._8_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[6];
    auVar80._0_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[6];
    auVar165 = vfmadd231pd_avx512vl(auVar165,auVar101,auVar80);
    auVar115._8_8_ = dStack_1230;
    auVar115._0_8_ = dStack_1238;
    auVar81._8_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[7];
    auVar81._0_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[7];
    auVar165 = vfmadd132pd_avx512vl(auVar115,auVar165,auVar81);
    auVar104._8_8_ = dStack_1308;
    auVar104._0_8_ = local_1310;
    auVar82._8_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[8];
    auVar82._0_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[8];
    auVar165 = vfmadd231pd_avx512vl(auVar165,auVar104,auVar82);
    auVar199._8_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[9];
    auVar199._0_8_ =
         local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.m_data.
         array[9];
    auVar112._8_8_ = dStack_1250;
    auVar112._0_8_ = dStack_1258;
    auVar165 = vfmadd231pd_fma(auVar165,auVar199,auVar112);
    auVar89._8_8_ = dStack_1388;
    auVar89._0_8_ = local_1390;
    auVar165 = vsubpd_avx(auVar165,auVar89);
    local_ce0._96_8_ = auVar165._0_8_;
    uVar3 = local_ce0._96_8_;
    pMStack_c78 = auVar165._8_8_;
    pdStack_c70 = (double *)
                  ((local_11e0 *
                    local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                    m_storage.m_data.array[0] +
                    dStack_11c8 *
                    local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                    m_storage.m_data.array[1] +
                    local_1200 *
                    local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                    m_storage.m_data.array[2] +
                    dStack_11e8 *
                    local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                    m_storage.m_data.array[3] +
                    local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                    m_storage.m_data.array[4] * local_1220 +
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[5] * dStack_1208 +
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[6] * local_1240 +
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[7] * dStack_1228 +
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[8] * local_1260 +
                   local_10f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.
                   m_storage.m_data.array[9] * dStack_1248) - local_1558);
    math::quaternion2rot((quaternion_t *)local_ce0);
    auVar200._8_8_ = 0;
    auVar200._0_8_ = local_1270;
    iVar4._M_current =
         (__return_storage_ptr__->
         super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    auVar269._8_8_ = pMStack_12a8;
    auVar269._0_8_ = local_12b0.m_matrix;
    auVar269._16_8_ = dStack_12a0;
    auVar269._24_16_ = auStack_1298;
    auVar269._40_8_ = dStack_1288;
    auVar269._48_8_ = dStack_1280;
    auVar269._56_8_ = dStack_1278;
    _local_1000 = vpermpd_avx512f(_DAT_001dc4c0,auVar269);
    local_fc0 = local_1270;
    auVar83._8_8_ = 0x8000000000000000;
    auVar83._0_8_ = 0x8000000000000000;
    auVar165 = vxorpd_avx512vl(auVar200,auVar83);
    auVar215._0_8_ = (double)uVar3 * (double)local_1000._0_8_;
    auVar215._8_8_ = (double)uVar3 * (double)local_1000._8_8_;
    auVar84._8_8_ = pMStack_c78;
    auVar84._0_8_ = pMStack_c78;
    auVar166 = vfnmsub132pd_avx512vl(stack0xfffffffffffff018,auVar215,auVar84);
    auVar216._8_8_ = pdStack_c70;
    auVar216._0_8_ = pdStack_c70;
    auStack_fb8 = vfnmadd231pd_fma(auVar166,auVar216,auStack_fd0);
    dStack_fa8 = ((double)pdStack_c70 * auVar165._0_8_ - dStack_1278 * (double)pMStack_c78) -
                 (double)uVar3 * dStack_1280;
    if (iVar4._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,4,0,3,4>const&>
                ((vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                  *)__return_storage_ptr__,iVar4,(Matrix<double,_3,_4,_0,_3,_4> *)local_1000);
    }
    else {
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[4] = dStack_fe0;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[5] = dStack_fd8;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[6] = (double)auStack_fd0._0_8_;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[7] = (double)auStack_fd0._8_8_;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[8] = local_1270;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[9] = (double)auStack_fb8._0_8_;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[10] = (double)auStack_fb8._8_8_;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[0xb] = dStack_fa8;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[0] = (double)local_1000._0_8_;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[1] = (double)local_1000._8_8_;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[2] = (double)auStack_ff0._0_8_;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[3] = (double)auStack_ff0._8_8_;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[4] = dStack_fe0;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[5] = dStack_fd8;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[6] = (double)auStack_fd0._0_8_;
      ((iVar4._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
      m_data.array[7] = (double)auStack_fd0._8_8_;
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
  }
LAB_00133055:
  if (local_1160.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_1160.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [3]);
  }
LAB_0013306e:
  if (local_12d0.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_12d0.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [3]);
  }
  return __return_storage_ptr__;
}

Assistant:

transformations_t upnp(
    const AbsoluteAdapterBase & adapter,
    const Indices & indices )
{
  assert( indices.size() > 2 );
    
  Eigen::Matrix<double,3,3> F = Eigen::Matrix3d::Zero();
  for( int i = 0; i < (int) indices.size(); i++ )
  {
    Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
    F += f * f.transpose();
  }
  
  Eigen::Matrix<double,3,3> H_inv = (indices.size() * Eigen::Matrix<double,3,3>::Identity()) - F;
  Eigen::Matrix<double,3,3> H = H_inv.inverse();
  
  Eigen::Matrix<double,3,10> I = Eigen::Matrix<double,3,10>::Zero();
  Eigen::Matrix<double,3,1> J = Eigen::Matrix<double,3,1>::Zero();
  Eigen::Matrix<double,3,10> Phi;
  
  for( int i = 0; i < (int) indices.size(); i++ )
  {
    Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
    Eigen::Matrix<double,3,3> Vk = H * ( f * f.transpose() - Eigen::Matrix<double,3,3>::Identity() );
    Eigen::Matrix<double,3,1> p = adapter.getPoint(indices[i]);
    Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[i]);
    
    fill3x10(p,Phi);
    I += Vk * Phi;
    J += Vk * v;
  }
  
  Eigen::Matrix<double,10,10> M = Eigen::Matrix<double,10,10>::Zero();
  Eigen::Matrix<double,1,10>  C = Eigen::Matrix<double,1,10>::Zero();
  double gamma = 0.0;
  
  for(int i = 0; i < (int) indices.size(); i++ )
  {    
    Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
    Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[i]);
    Eigen::Matrix<double,3,1> p = adapter.getPoint(indices[i]);
    
    fill3x10(p,Phi);
    Eigen::Matrix<double,3,3> temp = f*f.transpose() - Eigen::Matrix<double,3,3>::Identity();
    Eigen::Matrix<double,3,10> Ai =  temp * (Phi + I);
    Eigen::Matrix<double,3, 1> bi = -temp * (  v + J);
    
    M     += (Ai.transpose() * Ai);
    C     += (bi.transpose() * Ai);
    gamma += (bi.transpose() * bi);
  }
  
  //now do the main computation
  std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > quaternions1;
  if( indices.size() > 4 )
    modules::upnp_main_sym( M, C, gamma, quaternions1 );
  else
    modules::upnp_main( M, C, gamma, quaternions1 );
  
  //prepare the output vector
  transformations_t transformations;
  
  //Round 1: chirality check
  std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > quaternions2;
  for( int i = 0; i < quaternions1.size(); i++ )
  {
    rotation_t Rinv = math::quaternion2rot(quaternions1[i].second);
    
    Eigen::Matrix<double,10,1> s;
    modules::upnp_fill_s( quaternions1[i].second, s );
    translation_t tinv = I*s - J;
    
    if( transformations.size() == 0 )
    {
      transformation_t newTransformation;
      newTransformation.block<3,3>(0,0) = Rinv.transpose();
      newTransformation.block<3,1>(0,3) = -newTransformation.block<3,3>(0,0) * tinv;
      transformations.push_back(newTransformation);
    }
    
    int count_negative = 0;
    
    for( int j = 0; j < (int) indices.size(); j++ )
    {
      Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[j]) * adapter.getBearingVector(indices[j]);
      Eigen::Matrix<double,3,1> p = adapter.getPoint(indices[j]);
      Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[j]);
      
      Eigen::Vector3d p_est = Rinv*p + tinv - v;
      
      if( p_est.transpose()*f < 0.0 )
        count_negative++;
    }
    
    if( count_negative < floor(0.2 * indices.size() + 0.5) )
      quaternions2.push_back(quaternions1[i]);
  }
  
  if( quaternions2.size() == 0 )
    return transformations;
  else
    transformations.clear();
  
  //Round 2: Second order optimality (plus polishing)
  Eigen::Matrix<double,3,10> I_cay;
  Eigen::Matrix<double,10,10> M_cay;
  Eigen::Matrix<double,1,10>  C_cay;
  double gamma_cay;
  
  for( size_t q = 0; q < quaternions2.size(); q++ )
  {    
    I_cay = Eigen::Matrix<double,3,10>::Zero();
    rotation_t Rinv = math::quaternion2rot(quaternions2[q].second);
    
    for( int i = 0; i < (int) indices.size(); i++ )
    {
      Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
      Eigen::Matrix<double,3,3> Vk = H * ( f * f.transpose() - Eigen::Matrix<double,3,3>::Identity() );
      Eigen::Matrix<double,3,1> p = Rinv * adapter.getPoint(indices[i]);
      
      fill3x10(p,Phi);
      I_cay += Vk * Phi;
    }
    
    M_cay = Eigen::Matrix<double,10,10>::Zero();
    C_cay = Eigen::Matrix<double,1,10>::Zero();
    gamma_cay = 0.0;
    
    for(int i = 0; i < (int) indices.size(); i++ )
    {    
      Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
      Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[i]);
      Eigen::Matrix<double,3,1> p = Rinv * adapter.getPoint(indices[i]);
      
      fill3x10(p,Phi);
      Eigen::Matrix<double,3,3> temp = f*f.transpose() - Eigen::Matrix<double,3,3>::Identity();
      Eigen::Matrix<double,3,10> Ai =  temp * (Phi + I_cay);
      Eigen::Matrix<double,3,1> bi = -temp * (  v + J);
      
      M_cay     += (Ai.transpose() * Ai);
      C_cay     += (bi.transpose() * Ai);
      gamma_cay += (bi.transpose() * bi);
    }
    
    //now analyze the eigenvalues of the "Hessian"
    Eigen::Vector3d val;
    Eigen::Matrix3d Jacobian;
    f( M_cay, C_cay, gamma_cay, val );
    Jac( M_cay, C_cay, gamma_cay, Jacobian );
    std::vector<double> characteristicPolynomial;
    characteristicPolynomial.push_back(-1.0);
    characteristicPolynomial.push_back(Jacobian(2,2)+Jacobian(1,1)+Jacobian(0,0));
    characteristicPolynomial.push_back(-Jacobian(2,2)*Jacobian(1,1)-Jacobian(2,2)*Jacobian(0,0)-Jacobian(1,1)*Jacobian(0,0)+pow(Jacobian(1,2),2)+pow(Jacobian(0,2),2)+pow(Jacobian(0,1),2));
    characteristicPolynomial.push_back(Jacobian(2,2)*Jacobian(1,1)*Jacobian(0,0)+2*Jacobian(1,2)*Jacobian(0,2)*Jacobian(0,1)-Jacobian(2,2)*pow(Jacobian(0,1),2)-pow(Jacobian(1,2),2)*Jacobian(0,0)-Jacobian(1,1)*pow(Jacobian(0,2),2));
    std::vector<double> roots = opengv::math::o3_roots( characteristicPolynomial );
    
    bool allPositive = true;
    for( size_t i = 0; i < roots.size(); i++ )
    {
      if( roots[i] < 0.0 )
      {
        allPositive = false;
        break;
      }
    }
    
    if( true )//allPositive)//use all results for the moment
    {
      //perform the polishing step
      Eigen::Vector3d cay = - Jacobian.inverse() * val;
      rotation_t Rinv2 = math::cayley2rot(cay) * Rinv;
      quaternion_t q = math::rot2quaternion(Rinv2);
      
      Eigen::Matrix<double,10,1> s;
      modules::upnp_fill_s(q,s);
      translation_t tinv = I*s - J;
      
      transformation_t newTransformation;
      newTransformation.block<3,3>(0,0) = Rinv2.transpose();
      newTransformation.block<3,1>(0,3) = -newTransformation.block<3,3>(0,0) * tinv;
      transformations.push_back(newTransformation);
    }
  }
  
  //if there are no results, simply add the one with lowest score
  if( transformations.size() == 0 )
  {
    Eigen::Vector4d q = quaternions2[0].second;
    Eigen::Matrix<double,10,1> s;
    modules::upnp_fill_s(q,s);
    translation_t tinv = I*s - J;
    rotation_t Rinv = math::quaternion2rot(q);
    
    transformation_t newTransformation;
    newTransformation.block<3,3>(0,0) = Rinv.transpose();
    newTransformation.block<3,1>(0,3) = -newTransformation.block<3,3>(0,0) * tinv;
    transformations.push_back(newTransformation);
  }
  
  return transformations;
}